

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O3

void __thiscall uint256_tests::methods::test_method(methods *this)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 uVar4;
  undefined7 uVar5;
  int iVar6;
  undefined1 **ppuVar7;
  char *pcVar8;
  size_t sVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  long in_FS_OFFSET;
  readonly_property<bool> rVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  string_view str;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  undefined1 *local_9e8;
  undefined1 *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 *local_188;
  string *local_180;
  char *local_178;
  undefined1 local_170 [8];
  undefined1 local_168 [16];
  uchar local_158 [16];
  uint160 TmpS;
  undefined1 local_134 [12];
  string local_128;
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  undefined1 local_e0 [32];
  bool local_c0;
  undefined1 local_b8 [16];
  undefined1 *apuStack_a8 [2];
  uint256 TmpL;
  uchar local_78 [8];
  undefined1 local_70 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x98;
  file.m_begin = (iterator)&local_1b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c8,msg);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_198._8_8_ = "";
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  base_blob<256u>::GetHex_abi_cxx11_((string *)&TmpL,&R1L);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_b8,&R1L);
  if (TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ == local_b8._8_8_) {
    if (TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
      rVar12.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar6 = bcmp((void *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_,(void *)local_b8._0_8_,
                   TmpL.super_base_blob<256U>.m_data._M_elems._8_8_);
      rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar12.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_100[0] = rVar12.super_class_property<bool>.value;
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_128._M_dataplus._M_p._0_1_ = 0x67;
  local_128._M_dataplus._M_p._1_7_ = 0xf48b;
  local_128._M_string_length = 0xf48bcd;
  local_e0[8] = '\0';
  local_e0[0] = 200;
  local_e0[1] = 0x8f;
  local_e0[2] = '8';
  local_e0[3] = '\x01';
  local_e0[4] = '\0';
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  local_e0[0x10] = '8';
  local_e0[0x11] = 0xd1;
  local_e0[0x12] = '9';
  local_e0[0x13] = '\x01';
  local_e0[0x14] = '\0';
  local_e0[0x15] = '\0';
  local_e0[0x16] = '\0';
  local_e0[0x17] = '\0';
  local_e0[0x18] = SUB81(local_70,0);
  local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
  local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
  local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
  local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
  local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
  local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
  local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = (string *)local_b8;
  local_70 = (undefined1  [8])&TmpL;
  local_48._8_8_ = &TmpS;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf49008,
             (size_t)(local_134 + 0xc),0x98,local_e0,"R1L.ToString()",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apuStack_a8) {
    operator_delete((void *)local_b8._0_8_,(long)apuStack_a8[0] + 1);
  }
  if ((uchar *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      TmpL.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_,
                    TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x99;
  file_00.m_begin = (iterator)&local_1d8;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e8,
             msg_00);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_198._8_8_ = "";
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  base_blob<256u>::GetHex_abi_cxx11_((string *)&TmpL,&R2L);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_b8,&R2L);
  if (TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ == local_b8._8_8_) {
    if (TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
      rVar12.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar6 = bcmp((void *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_,(void *)local_b8._0_8_,
                   TmpL.super_base_blob<256U>.m_data._M_elems._8_8_);
      rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar12.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_100[0] = rVar12.super_class_property<bool>.value;
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_128._M_dataplus._M_p._0_1_ = 0x67;
  local_128._M_dataplus._M_p._1_7_ = 0xf48b;
  local_128._M_string_length = 0xf48bcd;
  local_e0[8] = '\0';
  local_e0[0] = 200;
  local_e0[1] = 0x8f;
  local_e0[2] = '8';
  local_e0[3] = '\x01';
  local_e0[4] = '\0';
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  local_e0[0x10] = '8';
  local_e0[0x11] = 0xd1;
  local_e0[0x12] = '9';
  local_e0[0x13] = '\x01';
  local_e0[0x14] = '\0';
  local_e0[0x15] = '\0';
  local_e0[0x16] = '\0';
  local_e0[0x17] = '\0';
  local_e0[0x18] = SUB81(local_70,0);
  local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
  local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
  local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
  local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
  local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
  local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
  local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = (string *)local_b8;
  local_70 = (undefined1  [8])&TmpL;
  local_48._8_8_ = &TmpS;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf49015,
             (size_t)(local_134 + 0xc),0x99,local_e0,"R2L.ToString()",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apuStack_a8) {
    operator_delete((void *)local_b8._0_8_,(long)apuStack_a8[0] + 1);
  }
  if ((uchar *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      TmpL.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_,
                    TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x9a;
  file_01.m_begin = (iterator)&local_1f8;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_208,
             msg_01);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_198._8_8_ = "";
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  base_blob<256u>::GetHex_abi_cxx11_((string *)&TmpL,OneL);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_b8,OneL);
  if (TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ == local_b8._8_8_) {
    if (TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
      rVar12.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar6 = bcmp((void *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_,(void *)local_b8._0_8_,
                   TmpL.super_base_blob<256U>.m_data._M_elems._8_8_);
      rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar12.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_100[0] = rVar12.super_class_property<bool>.value;
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_128._M_dataplus._M_p._0_1_ = 0x67;
  local_128._M_dataplus._M_p._1_7_ = 0xf48b;
  local_128._M_string_length = 0xf48bcd;
  local_e0[8] = '\0';
  local_e0[0] = 200;
  local_e0[1] = 0x8f;
  local_e0[2] = '8';
  local_e0[3] = '\x01';
  local_e0[4] = '\0';
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  local_e0[0x10] = '8';
  local_e0[0x11] = 0xd1;
  local_e0[0x12] = '9';
  local_e0[0x13] = '\x01';
  local_e0[0x14] = '\0';
  local_e0[0x15] = '\0';
  local_e0[0x16] = '\0';
  local_e0[0x17] = '\0';
  local_e0[0x18] = SUB81(local_70,0);
  local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
  local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
  local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
  local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
  local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
  local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
  local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = (string *)local_b8;
  local_70 = (undefined1  [8])&TmpL;
  local_48._8_8_ = &TmpS;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf49022,
             (size_t)(local_134 + 0xc),0x9a,local_e0,"OneL.ToString()",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apuStack_a8) {
    operator_delete((void *)local_b8._0_8_,(long)apuStack_a8[0] + 1);
  }
  if ((uchar *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      TmpL.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_,
                    TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9b;
  file_02.m_begin = (iterator)&local_218;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_228,
             msg_02);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_198._8_8_ = "";
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  base_blob<256u>::GetHex_abi_cxx11_((string *)&TmpL,MaxL);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_b8,MaxL);
  if (TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ == local_b8._8_8_) {
    if (TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ == 0) {
      rVar12.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar6 = bcmp((void *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_,(void *)local_b8._0_8_,
                   TmpL.super_base_blob<256U>.m_data._M_elems._8_8_);
      rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
    }
  }
  else {
    rVar12.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_100[0] = rVar12.super_class_property<bool>.value;
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  puVar1 = local_134 + 0xc;
  local_128._M_dataplus._M_p._0_1_ = 0x67;
  local_128._M_dataplus._M_p._1_7_ = 0xf48b;
  local_128._M_string_length = 0xf48bcd;
  local_e0[8] = '\0';
  local_e0[0] = 200;
  local_e0[1] = 0x8f;
  local_e0[2] = '8';
  local_e0[3] = '\x01';
  local_e0[4] = '\0';
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  local_e0[0x10] = '8';
  local_e0[0x11] = 0xd1;
  local_e0[0x12] = '9';
  local_e0[0x13] = '\x01';
  local_e0[0x14] = '\0';
  local_e0[0x15] = '\0';
  local_e0[0x16] = '\0';
  local_e0[0x17] = '\0';
  local_e0[0x18] = SUB81(local_70,0);
  local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
  local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
  local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
  local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
  local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
  local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
  local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &TmpS;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = (string *)local_b8;
  local_70 = (undefined1  [8])&TmpL;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf49030,
             (size_t)puVar1,0x9b,local_e0,"MaxL.ToString()",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apuStack_a8) {
    operator_delete((void *)local_b8._0_8_,(long)apuStack_a8[0] + 1);
  }
  if ((uchar *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      TmpL.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)TmpL.super_base_blob<256U>.m_data._M_elems._0_8_,
                    TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  TmpL.super_base_blob<256U>.m_data._M_elems[0x11] = uRam00000000013a24aa;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x10] = DAT_013a24a9;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x12] = uRam00000000013a24ab;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x13] = uRam00000000013a24ac;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x14] = uRam00000000013a24ad;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x15] = uRam00000000013a24ae;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x16] = uRam00000000013a24af;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x17] = uRam00000000013a24b0;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x19] = uRam00000000013a24b2;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x18] = uRam00000000013a24b1;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1a] = uRam00000000013a24b3;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1b] = uRam00000000013a24b4;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1c] = uRam00000000013a24b5;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1d] = uRam00000000013a24b6;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1e] = uRam00000000013a24b7;
  TmpL.super_base_blob<256U>.m_data._M_elems[0x1f] = DAT_013a24b8;
  TmpL.super_base_blob<256U>.m_data._M_elems[1] = uRam00000000013a249a;
  TmpL.super_base_blob<256U>.m_data._M_elems[0] = R1L;
  TmpL.super_base_blob<256U>.m_data._M_elems[2] = uRam00000000013a249b;
  TmpL.super_base_blob<256U>.m_data._M_elems[3] = uRam00000000013a249c;
  TmpL.super_base_blob<256U>.m_data._M_elems[4] = uRam00000000013a249d;
  TmpL.super_base_blob<256U>.m_data._M_elems[5] = uRam00000000013a249e;
  TmpL.super_base_blob<256U>.m_data._M_elems[6] = uRam00000000013a249f;
  TmpL.super_base_blob<256U>.m_data._M_elems[7] = uRam00000000013a24a0;
  TmpL.super_base_blob<256U>.m_data._M_elems[9] = uRam00000000013a24a2;
  TmpL.super_base_blob<256U>.m_data._M_elems[8] = uRam00000000013a24a1;
  TmpL.super_base_blob<256U>.m_data._M_elems[10] = uRam00000000013a24a3;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xb] = uRam00000000013a24a4;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xc] = uRam00000000013a24a5;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xd] = uRam00000000013a24a6;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xe] = uRam00000000013a24a7;
  TmpL.super_base_blob<256U>.m_data._M_elems[0xf] = uRam00000000013a24a8;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x9d;
  file_03.m_begin = (iterator)&local_238;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_248,
             msg_03);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
  auVar21[0] = -(DAT_013a24a9 == TmpL.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar21[1] = -(uRam00000000013a24aa == TmpL.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar21[2] = -(uRam00000000013a24ab == TmpL.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar21[3] = -(uRam00000000013a24ac == TmpL.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar21[4] = -(uRam00000000013a24ad == TmpL.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar21[5] = -(uRam00000000013a24ae == TmpL.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar21[6] = -(uRam00000000013a24af == TmpL.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar21[7] = -(uRam00000000013a24b0 == TmpL.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar21[8] = -(uRam00000000013a24b1 == TmpL.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar21[9] = -(uRam00000000013a24b2 == TmpL.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar21[10] = -(uRam00000000013a24b3 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar21[0xb] = -(uRam00000000013a24b4 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar21[0xc] = -(uRam00000000013a24b5 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar21[0xd] = -(uRam00000000013a24b6 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar21[0xe] = -(uRam00000000013a24b7 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar21[0xf] = -(DAT_013a24b8 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar13[0] = -(R1L == TmpL.super_base_blob<256U>.m_data._M_elems[0]);
  auVar13[1] = -(uRam00000000013a249a == TmpL.super_base_blob<256U>.m_data._M_elems[1]);
  auVar13[2] = -(uRam00000000013a249b == TmpL.super_base_blob<256U>.m_data._M_elems[2]);
  auVar13[3] = -(uRam00000000013a249c == TmpL.super_base_blob<256U>.m_data._M_elems[3]);
  auVar13[4] = -(uRam00000000013a249d == TmpL.super_base_blob<256U>.m_data._M_elems[4]);
  auVar13[5] = -(uRam00000000013a249e == TmpL.super_base_blob<256U>.m_data._M_elems[5]);
  auVar13[6] = -(uRam00000000013a249f == TmpL.super_base_blob<256U>.m_data._M_elems[6]);
  auVar13[7] = -(uRam00000000013a24a0 == TmpL.super_base_blob<256U>.m_data._M_elems[7]);
  auVar13[8] = -(uRam00000000013a24a1 == TmpL.super_base_blob<256U>.m_data._M_elems[8]);
  auVar13[9] = -(uRam00000000013a24a2 == TmpL.super_base_blob<256U>.m_data._M_elems[9]);
  auVar13[10] = -(uRam00000000013a24a3 == TmpL.super_base_blob<256U>.m_data._M_elems[10]);
  auVar13[0xb] = -(uRam00000000013a24a4 == TmpL.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar13[0xc] = -(uRam00000000013a24a5 == TmpL.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar13[0xd] = -(uRam00000000013a24a6 == TmpL.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar13[0xe] = -(uRam00000000013a24a7 == TmpL.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar13[0xf] = -(uRam00000000013a24a8 == TmpL.super_base_blob<256U>.m_data._M_elems[0xf]);
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_198._8_8_ = "";
  auVar13 = auVar13 & auVar21;
  local_b8[0] = (class_property<bool>)
                (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff);
  local_b8._8_8_ = (element_type *)0x0;
  apuStack_a8[0] = (undefined1 *)0x0;
  local_100._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_100._8_8_ = (element_type *)0xf48bcd;
  local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpL,0);
  local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpL >> 8);
  local_e0[8] = '\0';
  local_e0[0] = '\0';
  local_e0[1] = 0x9a;
  local_e0[2] = '8';
  local_e0[3] = '\x01';
  local_e0[4] = '\0';
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  local_e0[0x10] = '8';
  local_e0[0x11] = 0xd1;
  local_e0[0x12] = '9';
  local_e0[0x13] = '\x01';
  local_e0[0x14] = '\0';
  local_e0[0x15] = '\0';
  local_e0[0x16] = '\0';
  local_e0[0x17] = '\0';
  local_e0[0x18] = SUB81(puVar1,0);
  local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
  local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
  local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
  local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
  local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
  local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
  local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
  local_70 = (undefined1  [8])&R1L;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_01389a00;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = local_70;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xe37fc6,
             (size_t)local_100,0x9d,local_e0,"R1L",local_58);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)apuStack_a8)->_M_allocated_capacity);
  str._M_str = "21";
  str._M_len = 2;
  base_blob<256U>::SetHexDeprecated(&TmpL.super_base_blob<256U>,str);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xa0;
  file_04.m_begin = (iterator)&local_258;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_268,
             msg_04);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_198._8_8_ = "";
  local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_b8,&TmpL.super_base_blob<256U>);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_b8,
                     "0000000000000000000000000000000000000000000000000000000000000021");
  local_100[0] = (class_property<bool>)(class_property<bool>)(iVar6 == 0);
  local_100._8_8_ = (element_type *)0x0;
  aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_128._M_dataplus._M_p._0_1_ = 0x67;
  local_128._M_dataplus._M_p._1_7_ = 0xf48b;
  local_128._M_string_length = 0xf48bcd;
  local_e0[8] = '\0';
  local_e0[0] = 200;
  local_e0[1] = 0x8f;
  local_e0[2] = '8';
  local_e0[3] = '\x01';
  local_e0[4] = '\0';
  local_e0[5] = '\0';
  local_e0[6] = '\0';
  local_e0[7] = '\0';
  local_e0[0x10] = '8';
  local_e0[0x11] = 0xd1;
  local_e0[0x12] = '9';
  local_e0[0x13] = '\x01';
  local_e0[0x14] = '\0';
  local_e0[0x15] = '\0';
  local_e0[0x16] = '\0';
  local_e0[0x17] = '\0';
  local_e0[0x18] = SUB81(local_70,0);
  local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
  local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
  local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
  local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
  local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
  local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
  local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
  TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1bb3b63;
  local_58[8] = '\0';
  local_58._0_8_ = &PTR__lazy_ostream_013898d8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &TmpS;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_70 = (undefined1  [8])local_b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_100,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf4903e,
             (size_t)(local_134 + 0xc),0xa0,local_e0,
             "\"0000000000000000000000000000000000000000000000000000000000000021\"",local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apuStack_a8) {
    operator_delete((void *)local_b8._0_8_,(long)apuStack_a8[0] + 1);
  }
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_270 = "";
  ppuVar7 = &local_288;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xa1;
  file_05.m_begin = (iterator)&local_278;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar7,msg_05);
  local_b8._8_8_ = local_b8._9_8_ << 8;
  local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
  apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_100,&R2L);
  str_00._M_str = (char *)ppuVar7;
  str_00._M_len = local_100._0_8_;
  detail::FromHex<uint256>((optional<uint256> *)local_e0,(detail *)local_100._8_8_,str_00);
  if (local_c0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    auVar22[0] = -(local_e0[0] == R2L);
    auVar22[1] = -(local_e0[1] == uRam00000000013a24ce);
    auVar22[2] = -(local_e0[2] == uRam00000000013a24cf);
    auVar22[3] = -(local_e0[3] == uRam00000000013a24d0);
    auVar22[4] = -(local_e0[4] == uRam00000000013a24d1);
    auVar22[5] = -(local_e0[5] == uRam00000000013a24d2);
    auVar22[6] = -(local_e0[6] == uRam00000000013a24d3);
    auVar22[7] = -(local_e0[7] == uRam00000000013a24d4);
    auVar22[8] = -(local_e0[8] == uRam00000000013a24d5);
    auVar22[9] = -(local_e0[9] == uRam00000000013a24d6);
    auVar22[10] = -(local_e0[10] == uRam00000000013a24d7);
    auVar22[0xb] = -(local_e0[0xb] == uRam00000000013a24d8);
    auVar22[0xc] = -(local_e0[0xc] == uRam00000000013a24d9);
    auVar22[0xd] = -(local_e0[0xd] == uRam00000000013a24da);
    auVar22[0xe] = -(local_e0[0xe] == uRam00000000013a24db);
    auVar22[0xf] = -(local_e0[0xf] == uRam00000000013a24dc);
    auVar28[0] = -(DAT_013a24dd == local_e0[0x10]);
    auVar28[1] = -(uRam00000000013a24de == local_e0[0x11]);
    auVar28[2] = -(uRam00000000013a24df == local_e0[0x12]);
    auVar28[3] = -(uRam00000000013a24e0 == local_e0[0x13]);
    auVar28[4] = -(uRam00000000013a24e1 == local_e0[0x14]);
    auVar28[5] = -(uRam00000000013a24e2 == local_e0[0x15]);
    auVar28[6] = -(uRam00000000013a24e3 == local_e0[0x16]);
    auVar28[7] = -(uRam00000000013a24e4 == local_e0[0x17]);
    auVar28[8] = -(uRam00000000013a24e5 == local_e0[0x18]);
    auVar28[9] = -(uRam00000000013a24e6 == local_e0[0x19]);
    auVar28[10] = -(uRam00000000013a24e7 == local_e0[0x1a]);
    auVar28[0xb] = -(uRam00000000013a24e8 == local_e0[0x1b]);
    auVar28[0xc] = -(uRam00000000013a24e9 == local_e0[0x1c]);
    auVar28[0xd] = -(uRam00000000013a24ea == local_e0[0x1d]);
    auVar28[0xe] = -(uRam00000000013a24eb == local_e0[0x1e]);
    auVar28[0xf] = -(DAT_013a24ec == local_e0[0x1f]);
    auVar28 = auVar28 & auVar22;
    local_128._M_dataplus._M_p._0_1_ =
         (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_70 = (undefined1  [8])0xf48b67;
    sStack_68.px = (element_type *)0xf48bcd;
    local_58[8] = '\0';
    local_58._0_8_ = &PTR__lazy_ostream_01389a00;
    local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_48._8_8_ = &TmpS;
    local_168._0_8_ = &R2L;
    local_1a8[8] = 0;
    local_1a8._0_8_ = &PTR__lazy_ostream_01389a00;
    local_198._8_8_ = (uint160 *)local_168;
    local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = (optional<uint256> *)local_e0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_134 + 0xc),(lazy_ostream *)local_b8,1,2,REQUIRE,0xf48cf5,
               (size_t)local_70,0xa1,local_58,"R2L",local_1a8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_128.field_2._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ != &aStack_f0) {
      operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
    }
    local_298 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_290 = "";
    ppuVar7 = &local_2a8;
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0xa2;
    file_06.m_begin = (iterator)&local_298;
    msg_06.m_end = pvVar11;
    msg_06.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)ppuVar7,msg_06
              );
    local_b8._8_8_ = local_b8._9_8_ << 8;
    local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
    apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
    apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
    base_blob<256u>::ToString_abi_cxx11_((string *)local_100,ZeroL);
    str_01._M_str = (char *)ppuVar7;
    str_01._M_len = local_100._0_8_;
    detail::FromHex<uint256>((optional<uint256> *)local_e0,(detail *)local_100._8_8_,str_01);
    if (local_c0 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_128.field_2._M_allocated_capacity = 0;
      local_128.field_2._8_8_ = 0;
      local_128._M_dataplus._M_p._0_1_ = 0;
      local_128._M_dataplus._M_p._1_7_ = 0;
      local_128._M_string_length = 0;
      auVar2[1] = local_e0[1];
      auVar2[0] = local_e0[0];
      auVar2[2] = local_e0[2];
      auVar2[3] = local_e0[3];
      auVar2[4] = local_e0[4];
      auVar2[5] = local_e0[5];
      auVar2[6] = local_e0[6];
      auVar2[7] = local_e0[7];
      auVar2[8] = local_e0[8];
      auVar2[9] = local_e0[9];
      auVar2[10] = local_e0[10];
      auVar2[0xb] = local_e0[0xb];
      auVar2[0xc] = local_e0[0xc];
      auVar2[0xd] = local_e0[0xd];
      auVar2[0xe] = local_e0[0xe];
      auVar2[0xf] = local_e0[0xf];
      auVar29[1] = local_e0[0x11];
      auVar29[0] = local_e0[0x10];
      auVar29[2] = local_e0[0x12];
      auVar29[3] = local_e0[0x13];
      auVar29[4] = local_e0[0x14];
      auVar29[5] = local_e0[0x15];
      auVar29[6] = local_e0[0x16];
      auVar29[7] = local_e0[0x17];
      auVar29[8] = local_e0[0x18];
      auVar29[9] = local_e0[0x19];
      auVar29[10] = local_e0[0x1a];
      auVar29[0xb] = local_e0[0x1b];
      auVar29[0xc] = local_e0[0x1c];
      auVar29[0xd] = local_e0[0x1d];
      auVar29[0xe] = local_e0[0x1e];
      auVar29[0xf] = local_e0[0x1f];
      auVar29 = auVar29 | auVar2;
      auVar30[0] = -(auVar29[0] == '\0');
      auVar30[1] = -(auVar29[1] == '\0');
      auVar30[2] = -(auVar29[2] == '\0');
      auVar30[3] = -(auVar29[3] == '\0');
      auVar30[4] = -(auVar29[4] == '\0');
      auVar30[5] = -(auVar29[5] == '\0');
      auVar30[6] = -(auVar29[6] == '\0');
      auVar30[7] = -(auVar29[7] == '\0');
      auVar30[8] = -(auVar29[8] == '\0');
      auVar30[9] = -(auVar29[9] == '\0');
      auVar30[10] = -(auVar29[10] == '\0');
      auVar30[0xb] = -(auVar29[0xb] == '\0');
      auVar30[0xc] = -(auVar29[0xc] == '\0');
      auVar30[0xd] = -(auVar29[0xd] == '\0');
      auVar30[0xe] = -(auVar29[0xe] == '\0');
      auVar30[0xf] = -(auVar29[0xf] == '\0');
      local_70[0] = (ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar30[0xf] >> 7) << 0xf) == 0xffff;
      sStack_68.px = (element_type *)0x0;
      sStack_68.pn.pi_ = (sp_counted_base *)0x0;
      TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b9687d;
      TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
           (long)
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
           + 0x66;
      local_168._0_8_ = (optional<uint256> *)local_e0;
      local_58[8] = '\0';
      local_58._0_8_ = &PTR__lazy_ostream_01389a00;
      local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_1a8[8] = 0;
      local_1a8._0_8_ = &PTR__lazy_ostream_01389a00;
      local_198._8_8_ = &local_180;
      local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
      pvVar10 = (iterator)0x1;
      pvVar11 = (iterator)0x2;
      pcVar8 = (char *)0xa2;
      local_180 = (string *)(local_134 + 0xc);
      local_48._8_8_ = (uint160 *)local_168;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf48d1e,
                 (size_t)&TmpS,0xa2,local_58,"uint256()",local_1a8);
      boost::detail::shared_count::~shared_count(&sStack_68.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ != &aStack_f0) {
        operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
      }
      base_blob<256u>::ToString_abi_cxx11_((string *)local_58,&R1L);
      str_02._M_str = pcVar8;
      str_02._M_len = local_58._0_8_;
      detail::FromHex<uint256>
                ((optional<uint256> *)local_e0,(detail *)CONCAT71(local_58._9_7_,local_58[8]),str_02
                );
      if (local_c0 == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        TmpL.super_base_blob<256U>.m_data._M_elems[1] = local_e0[1];
        TmpL.super_base_blob<256U>.m_data._M_elems[0] = local_e0[0];
        TmpL.super_base_blob<256U>.m_data._M_elems[2] = local_e0[2];
        TmpL.super_base_blob<256U>.m_data._M_elems[3] = local_e0[3];
        TmpL.super_base_blob<256U>.m_data._M_elems[4] = local_e0[4];
        TmpL.super_base_blob<256U>.m_data._M_elems[5] = local_e0[5];
        TmpL.super_base_blob<256U>.m_data._M_elems[6] = local_e0[6];
        TmpL.super_base_blob<256U>.m_data._M_elems[7] = local_e0[7];
        TmpL.super_base_blob<256U>.m_data._M_elems[9] = local_e0[9];
        TmpL.super_base_blob<256U>.m_data._M_elems[8] = local_e0[8];
        TmpL.super_base_blob<256U>.m_data._M_elems[10] = local_e0[10];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xb] = local_e0[0xb];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xc] = local_e0[0xc];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xd] = local_e0[0xd];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xe] = local_e0[0xe];
        TmpL.super_base_blob<256U>.m_data._M_elems[0xf] = local_e0[0xf];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x11] = local_e0[0x11];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x10] = local_e0[0x10];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x12] = local_e0[0x12];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x13] = local_e0[0x13];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x14] = local_e0[0x14];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x15] = local_e0[0x15];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x16] = local_e0[0x16];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x17] = local_e0[0x17];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x19] = local_e0[0x19];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x18] = local_e0[0x18];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1a] = local_e0[0x1a];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1b] = local_e0[0x1b];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1c] = local_e0[0x1c];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1d] = local_e0[0x1d];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1e] = local_e0[0x1e];
        TmpL.super_base_blob<256U>.m_data._M_elems[0x1f] = local_e0[0x1f];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._0_8_ != &local_48) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
        }
        local_2b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_2b0 = "";
        local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0xa5;
        file_07.m_begin = (iterator)&local_2b8;
        msg_07.m_end = pvVar11;
        msg_07.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c8
                   ,msg_07);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_58,(equal_coll_impl *)local_1a8,&R1L,R1S,R1Array,
                   R1Array + 0x20);
        local_e0[8] = '\0';
        local_e0[0] = '\b';
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = 0xa1;
        local_e0[0x19] = 0xae;
        local_e0[0x1a] = 0xf4;
        local_e0[0x1b] = '\0';
        local_e0[0x1c] = '\0';
        local_e0[0x1d] = '\0';
        local_e0[0x1e] = '\0';
        local_e0[0x1f] = '\0';
        local_2d8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_2d0 = "";
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf48f46,
                   (size_t)&local_2d8,0xa5,"R1L.end()","R1Array","R1Array + uint256::size()");
        boost::detail::shared_count::~shared_count((shared_count *)&local_48._M_allocated_capacity);
        local_2e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_2e0 = "";
        local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0xa6;
        file_08.m_begin = (iterator)&local_2e8;
        msg_08.m_end = pvVar11;
        msg_08.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f8
                   ,msg_08);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_58,(equal_coll_impl *)local_1a8,(uchar *)&TmpL,local_78
                   ,R1Array,R1Array + 0x20);
        local_e0[8] = '\0';
        local_e0[0] = '\b';
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = 0xa1;
        local_e0[0x19] = 0xae;
        local_e0[0x1a] = 0xf4;
        local_e0[0x1b] = '\0';
        local_e0[0x1c] = '\0';
        local_e0[0x1d] = '\0';
        local_e0[0x1e] = '\0';
        local_e0[0x1f] = '\0';
        local_308 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_300 = "";
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf490fe,
                   (size_t)&local_308,0xa6,"TmpL.end()","R1Array","R1Array + uint256::size()");
        boost::detail::shared_count::~shared_count((shared_count *)&local_48._M_allocated_capacity);
        local_318 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_310 = "";
        local_328 = &boost::unit_test::basic_cstring<char_const>::null;
        local_320 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0xa7;
        file_09.m_begin = (iterator)&local_318;
        msg_09.m_end = pvVar11;
        msg_09.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_328
                   ,msg_09);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_58,(equal_coll_impl *)local_1a8,&R2L,R2S,R2Array,
                   R2Array + 0x20);
        local_e0[8] = '\0';
        local_e0[0] = '\b';
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = 0xa1;
        local_e0[0x19] = 0xae;
        local_e0[0x1a] = 0xf4;
        local_e0[0x1b] = '\0';
        local_e0[0x1c] = '\0';
        local_e0[0x1d] = '\0';
        local_e0[0x1e] = '\0';
        local_e0[0x1f] = '\0';
        local_338 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_330 = "";
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf48f39,
                   (size_t)&local_338,0xa7,"R2L.end()","R2Array","R2Array + uint256::size()");
        boost::detail::shared_count::~shared_count((shared_count *)&local_48._M_allocated_capacity);
        local_348 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_340 = "";
        local_358 = &boost::unit_test::basic_cstring<char_const>::null;
        local_350 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0xa8;
        file_10.m_begin = (iterator)&local_348;
        msg_10.m_end = pvVar11;
        msg_10.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_358
                   ,msg_10);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_58,(equal_coll_impl *)local_1a8,ZeroL,ZeroS,ZeroArray,
                   ZeroArray + 0x20);
        local_e0[8] = '\0';
        local_e0[0] = '\b';
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = 0xa1;
        local_e0[0x19] = 0xae;
        local_e0[0x1a] = 0xf4;
        local_e0[0x1b] = '\0';
        local_e0[0x1c] = '\0';
        local_e0[0x1d] = '\0';
        local_e0[0x1e] = '\0';
        local_e0[0x1f] = '\0';
        local_368 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_360 = "";
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf49142,
                   (size_t)&local_368,0xa8,"ZeroL.end()","ZeroArray","ZeroArray + uint256::size()");
        boost::detail::shared_count::~shared_count((shared_count *)&local_48._M_allocated_capacity);
        local_378 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_370 = "";
        local_388 = &boost::unit_test::basic_cstring<char_const>::null;
        local_380 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0xa9;
        file_11.m_begin = (iterator)&local_378;
        msg_11.m_end = pvVar11;
        msg_11.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_388
                   ,msg_11);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_58,(equal_coll_impl *)local_1a8,OneL,OneS,OneArray,
                   OneArray + 0x20);
        local_e0[8] = '\0';
        local_e0[0] = '\b';
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = 0xa1;
        local_e0[0x19] = 0xae;
        local_e0[0x1a] = 0xf4;
        local_e0[0x1b] = '\0';
        local_e0[0x1c] = '\0';
        local_e0[0x1d] = '\0';
        local_e0[0x1e] = '\0';
        local_e0[0x1f] = '\0';
        local_398 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_390 = "";
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf49182,
                   (size_t)&local_398,0xa9,"OneL.end()","OneArray","OneArray + uint256::size()");
        puVar1 = local_134 + 0xc;
        boost::detail::shared_count::~shared_count((shared_count *)&local_48._M_allocated_capacity);
        local_3a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_3a0 = "";
        local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_12.m_end = (iterator)0xaa;
        file_12.m_begin = (iterator)&local_3a8;
        msg_12.m_end = pvVar11;
        msg_12.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3b8
                   ,msg_12);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        local_168[0] = ' ';
        local_168[1] = '\0';
        local_168[2] = '\0';
        local_168[3] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = ' ';
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(local_168,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_168 >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 0x88;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])&TmpS;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01388f48;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf491be,
                   (size_t)local_100,0xaa,local_e0,"sizeof(R1L)",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_3c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_3c0 = "";
        local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_13.m_end = (iterator)0xab;
        file_13.m_begin = (iterator)&local_3c8;
        msg_13.m_end = pvVar11;
        msg_13.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3d8
                   ,msg_13);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = ' ';
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
        local_168[0] = ' ';
        local_168[1] = '\0';
        local_168[2] = '\0';
        local_168[3] = '\0';
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 'H';
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_013890c8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf491c9,
                   (size_t)local_100,0xab,local_e0,"32",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_3e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_3e0 = "";
        local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_14.m_end = (iterator)0xac;
        file_14.m_begin = (iterator)&local_3e8;
        msg_14.m_end = pvVar11;
        msg_14.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3f8
                   ,msg_14);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = ' ';
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        local_168[0] = ' ';
        local_168[1] = '\0';
        local_168[2] = '\0';
        local_168[3] = '\0';
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 0x88;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_013890c8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf491be,
                   (size_t)local_100,0xac,local_e0,"32",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_408 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_400 = "";
        local_418 = &boost::unit_test::basic_cstring<char_const>::null;
        local_410 = &boost::unit_test::basic_cstring<char_const>::null;
        file_15.m_end = (iterator)0xad;
        file_15.m_begin = (iterator)&local_408;
        msg_15.m_end = pvVar11;
        msg_15.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_418
                   ,msg_15);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = ' ';
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        local_168[0] = ' ';
        local_168[1] = '\0';
        local_168[2] = '\0';
        local_168[3] = '\0';
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 0x88;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_013890c8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf491d5,
                   (size_t)local_100,0xad,local_e0,"32",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_428 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_420 = "";
        local_438 = &boost::unit_test::basic_cstring<char_const>::null;
        local_430 = &boost::unit_test::basic_cstring<char_const>::null;
        file_16.m_end = (iterator)0xae;
        file_16.m_begin = (iterator)&local_428;
        msg_16.m_end = pvVar11;
        msg_16.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_438
                   ,msg_16);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = ' ';
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        local_168[0] = ' ';
        local_168[1] = '\0';
        local_168[2] = '\0';
        local_168[3] = '\0';
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 0x88;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_013890c8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf491e0,
                   (size_t)local_100,0xae,local_e0,"32",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_448 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_440 = "";
        local_458 = &boost::unit_test::basic_cstring<char_const>::null;
        local_450 = &boost::unit_test::basic_cstring<char_const>::null;
        file_17.m_end = (iterator)0xaf;
        file_17.m_begin = (iterator)&local_448;
        msg_17.m_end = pvVar11;
        msg_17.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_458
                   ,msg_17);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = ' ';
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        local_168._0_4_ = 0x20;
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        uVar4 = local_128._M_dataplus._M_p._0_1_;
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        uVar5 = local_128._M_dataplus._M_p._1_7_;
        local_e0[8] = '\0';
        local_e0[0] = 0x88;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_013890c8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf491ed,
                   (size_t)local_100,0xaf,local_e0,"32",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_468 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_460 = "";
        local_478 = &boost::unit_test::basic_cstring<char_const>::null;
        local_470 = &boost::unit_test::basic_cstring<char_const>::null;
        file_18.m_end = (iterator)0xb0;
        file_18.m_begin = (iterator)&local_468;
        msg_18.m_end = pvVar11;
        msg_18.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_478
                   ,msg_18);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = R1S;
        local_168._0_8_ = R1S;
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_e0[8] = '\0';
        local_e0[0] = 0xc0;
        local_e0[1] = 0xe3;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_0138e3c0;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        local_128._M_dataplus._M_p._0_1_ = uVar4;
        local_128._M_dataplus._M_p._1_7_ = uVar5;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf491f9,
                   (size_t)local_100,0xb0,local_e0,"R1L.end()",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_488 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_480 = "";
        local_498 = &boost::unit_test::basic_cstring<char_const>::null;
        local_490 = &boost::unit_test::basic_cstring<char_const>::null;
        file_19.m_end = (iterator)0xb1;
        file_19.m_begin = (iterator)&local_488;
        msg_19.m_end = pvVar11;
        msg_19.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_498
                   ,msg_19);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = R2S;
        local_168._0_8_ = R2S;
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 0xc0;
        local_e0[1] = 0xe3;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_0138e3c0;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf4920a,
                   (size_t)local_100,0xb1,local_e0,"R2L.end()",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_4a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_4a0 = "";
        local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_20.m_end = (iterator)0xb2;
        file_20.m_begin = (iterator)&local_4a8;
        msg_20.m_end = pvVar11;
        msg_20.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4b8
                   ,msg_20);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = OneS;
        local_168._0_8_ = OneS;
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 0xc0;
        local_e0[1] = 0xe3;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_0138e3c0;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf4921b,
                   (size_t)local_100,0xb2,local_e0,"OneL.end()",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_4c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_4c0 = "";
        local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_21.m_end = (iterator)0xb3;
        file_21.m_begin = (iterator)&local_4c8;
        msg_21.m_end = pvVar11;
        msg_21.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4d8
                   ,msg_21);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = MaxS;
        local_168._0_8_ = MaxS;
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 0xc0;
        local_e0[1] = 0xe3;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_0138e3c0;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf4922d,
                   (size_t)local_100,0xb3,local_e0,"MaxL.end()",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_4e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_4e0 = "";
        local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_22.m_end = (iterator)0xb4;
        file_22.m_begin = (iterator)&local_4e8;
        msg_22.m_end = pvVar11;
        msg_22.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4f8
                   ,msg_22);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = local_78;
        local_168._0_8_ = TmpS.super_base_blob<160U>.m_data._M_elems._0_8_;
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = '\0';
        local_e0[1] = 0xe4;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_0138e400;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf4924a,
                   (size_t)local_100,0xb4,local_e0,"TmpL.end()",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_508 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_500 = "";
        local_518 = &boost::unit_test::basic_cstring<char_const>::null;
        local_510 = &boost::unit_test::basic_cstring<char_const>::null;
        file_23.m_end = (iterator)0xb5;
        file_23.m_begin = (iterator)&local_508;
        msg_23.m_end = pvVar11;
        msg_23.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_518
                   ,msg_23);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_198._8_8_ = "";
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = ' ';
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
        local_168[0] = ' ';
        local_168[1] = '\0';
        local_168[2] = '\0';
        local_168[3] = '\0';
        local_b8[0] = (class_property<bool>)0x1;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = "";
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 'H';
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_013890c8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf4925c,
                   (size_t)local_100,0xb5,local_e0,"32",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_528 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_520 = "";
        local_538 = &boost::unit_test::basic_cstring<char_const>::null;
        local_530 = &boost::unit_test::basic_cstring<char_const>::null;
        file_24.m_end = (iterator)0xb6;
        file_24.m_begin = (iterator)&local_528;
        msg_24.m_end = pvVar11;
        msg_24.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_538
                   ,msg_24);
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_01388f08;
        local_198._8_8_ = "";
        local_198._0_8_ = boost::unit_test::lazy_ostream::inst;
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = ' ';
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
        TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
        local_168._0_4_ = 0x20;
        local_b8[0] = (class_property<bool>)true;
        local_b8._8_8_ = (element_type *)0x0;
        apuStack_a8[0] = (undefined1 *)0x0;
        local_100._0_8_ =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_100._8_8_ = (element_type *)0xf48bcd;
        local_128._M_dataplus._M_p._0_1_ = SUB81(&TmpS,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&TmpS >> 8);
        local_e0[8] = '\0';
        local_e0[0] = 'H';
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        puVar1 = local_134 + 0xc;
        local_e0[0x18] = SUB81(puVar1,0);
        local_e0[0x19] = (undefined1)((ulong)puVar1 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)puVar1 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)puVar1 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)puVar1 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)puVar1 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)puVar1 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)puVar1 >> 0x38);
        local_70 = (undefined1  [8])local_168;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_013890c8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_70;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_b8,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xf49272,
                   (size_t)local_100,0xb6,local_e0,"32",local_58);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)apuStack_a8)->_M_allocated_capacity);
        local_198 = (undefined1  [16])0x0;
        local_1a8._0_8_ = (_func_int **)0x0;
        local_1a8[8] = false;
        local_1a8._9_7_ = 0;
        std::vector<std::byte,zero_after_free_allocator<std::byte>>::
        _M_range_insert<std::byte_const*>
                  ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_1a8,0,&R1L,R1S);
        local_548 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_540 = "";
        local_558 = &boost::unit_test::basic_cstring<char_const>::null;
        local_550 = &boost::unit_test::basic_cstring<char_const>::null;
        file_25.m_end = (iterator)0xba;
        file_25.m_begin = (iterator)&local_548;
        msg_25.m_end = pvVar11;
        msg_25.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_558
                   ,msg_25);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_100._0_8_ = &aStack_f0;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)local_100,local_1a8._0_8_ + local_198._8_8_,local_1a8._8_8_);
        local_128._M_dataplus._M_p._0_1_ = SUB81(&local_128.field_2,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_128.field_2 >> 8);
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)(local_134 + 0xc),R1Array,0xf49ce0);
        if (local_100._8_8_ == local_128._M_string_length) {
          if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
            rVar12.super_class_property<bool>.value = (class_property<bool>)true;
          }
          else {
            iVar6 = bcmp((void *)local_100._0_8_,
                         (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                          local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
            rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
          }
        }
        else {
          rVar12.super_class_property<bool>.value = (class_property<bool>)false;
        }
        local_70[0] = rVar12.super_class_property<bool>.value;
        sStack_68.px = (element_type *)0x0;
        sStack_68.pn.pi_ = (sp_counted_base *)0x0;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b9687d;
        TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
             + 0x66;
        local_168._0_8_ = (string *)local_100;
        local_e0[8] = '\0';
        local_e0[0] = 200;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81(local_168,0);
        local_e0[0x19] = (undefined1)((ulong)local_168 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_168 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_168 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_168 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_168 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_168 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_168 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_180;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        sVar9 = 0xba;
        local_180 = (string *)(local_134 + 0xc);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4928a,
                   (size_t)&TmpS,0xba,local_e0,"std::string(R1Array,R1Array+32)",local_58);
        boost::detail::shared_count::~shared_count(&sStack_68.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),
                          local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != &aStack_f0) {
          operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
        }
        DataStream::read((DataStream *)local_1a8,(int)&TmpL,(void *)0x20,sVar9);
        local_568 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_560 = "";
        local_578 = &boost::unit_test::basic_cstring<char_const>::null;
        local_570 = &boost::unit_test::basic_cstring<char_const>::null;
        file_26.m_end = (iterator)0xbc;
        file_26.m_begin = (iterator)&local_568;
        msg_26.m_end = pvVar11;
        msg_26.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_578
                   ,msg_26);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        auVar23[0] = -(DAT_013a24a9 == TmpL.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar23[1] = -(uRam00000000013a24aa == TmpL.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar23[2] = -(uRam00000000013a24ab == TmpL.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar23[3] = -(uRam00000000013a24ac == TmpL.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar23[4] = -(uRam00000000013a24ad == TmpL.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar23[5] = -(uRam00000000013a24ae == TmpL.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar23[6] = -(uRam00000000013a24af == TmpL.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar23[7] = -(uRam00000000013a24b0 == TmpL.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar23[8] = -(uRam00000000013a24b1 == TmpL.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar23[9] = -(uRam00000000013a24b2 == TmpL.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar23[10] = -(uRam00000000013a24b3 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar23[0xb] = -(uRam00000000013a24b4 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar23[0xc] = -(uRam00000000013a24b5 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar23[0xd] = -(uRam00000000013a24b6 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar23[0xe] = -(uRam00000000013a24b7 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar23[0xf] = -(DAT_013a24b8 == TmpL.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar14[0] = -(R1L == TmpL.super_base_blob<256U>.m_data._M_elems[0]);
        auVar14[1] = -(uRam00000000013a249a == TmpL.super_base_blob<256U>.m_data._M_elems[1]);
        auVar14[2] = -(uRam00000000013a249b == TmpL.super_base_blob<256U>.m_data._M_elems[2]);
        auVar14[3] = -(uRam00000000013a249c == TmpL.super_base_blob<256U>.m_data._M_elems[3]);
        auVar14[4] = -(uRam00000000013a249d == TmpL.super_base_blob<256U>.m_data._M_elems[4]);
        auVar14[5] = -(uRam00000000013a249e == TmpL.super_base_blob<256U>.m_data._M_elems[5]);
        auVar14[6] = -(uRam00000000013a249f == TmpL.super_base_blob<256U>.m_data._M_elems[6]);
        auVar14[7] = -(uRam00000000013a24a0 == TmpL.super_base_blob<256U>.m_data._M_elems[7]);
        auVar14[8] = -(uRam00000000013a24a1 == TmpL.super_base_blob<256U>.m_data._M_elems[8]);
        auVar14[9] = -(uRam00000000013a24a2 == TmpL.super_base_blob<256U>.m_data._M_elems[9]);
        auVar14[10] = -(uRam00000000013a24a3 == TmpL.super_base_blob<256U>.m_data._M_elems[10]);
        auVar14[0xb] = -(uRam00000000013a24a4 == TmpL.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar14[0xc] = -(uRam00000000013a24a5 == TmpL.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar14[0xd] = -(uRam00000000013a24a6 == TmpL.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar14[0xe] = -(uRam00000000013a24a7 == TmpL.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar14[0xf] = -(uRam00000000013a24a8 == TmpL.super_base_blob<256U>.m_data._M_elems[0xf]);
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        auVar14 = auVar14 & auVar23;
        local_100[0] = (class_property<bool>)
                       (class_property<bool>)
                       ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff);
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_100._8_8_ = (element_type *)0x0;
        aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
        local_128._M_dataplus._M_p._0_1_ = 0x67;
        local_128._M_dataplus._M_p._1_7_ = 0xf48b;
        local_128._M_string_length = 0xf48bcd;
        local_70 = (undefined1  [8])&R1L;
        local_e0[8] = '\0';
        local_e0[0] = '\0';
        local_e0[1] = 0x9a;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81((assertion_result *)local_70,0);
        local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01389a00;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = &TmpL;
        local_48._8_8_ = &TmpS;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xe39232,
                   (size_t)(local_134 + 0xc),0xbc,local_e0,"TmpL",local_58);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity)
        ;
        uVar3 = local_1a8._0_8_;
        if (local_1a8._8_8_ != local_1a8._0_8_) {
          local_1a8._8_8_ = local_1a8._0_8_;
        }
        local_198._8_8_ = 0;
        std::vector<std::byte,zero_after_free_allocator<std::byte>>::
        _M_range_insert<std::byte_const*>
                  ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_1a8,uVar3,ZeroL,
                   ZeroS);
        local_588 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_580 = "";
        local_598 = &boost::unit_test::basic_cstring<char_const>::null;
        local_590 = &boost::unit_test::basic_cstring<char_const>::null;
        file_27.m_end = (iterator)0xbf;
        file_27.m_begin = (iterator)&local_588;
        msg_27.m_end = pvVar11;
        msg_27.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_598
                   ,msg_27);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_100._0_8_ = &aStack_f0;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)local_100,local_1a8._0_8_ + local_198._8_8_,local_1a8._8_8_);
        local_128._M_dataplus._M_p._0_1_ = SUB81(&local_128.field_2,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_128.field_2 >> 8);
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)(local_134 + 0xc),ZeroArray,0xf49d40);
        if (local_100._8_8_ == local_128._M_string_length) {
          if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
            rVar12.super_class_property<bool>.value = (class_property<bool>)true;
          }
          else {
            iVar6 = bcmp((void *)local_100._0_8_,
                         (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                          local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
            rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
          }
        }
        else {
          rVar12.super_class_property<bool>.value = (class_property<bool>)false;
        }
        local_70[0] = rVar12.super_class_property<bool>.value;
        sStack_68.px = (element_type *)0x0;
        sStack_68.pn.pi_ = (sp_counted_base *)0x0;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b9687d;
        TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
             + 0x66;
        local_168._0_8_ = (string *)local_100;
        local_e0[8] = '\0';
        local_e0[0] = 200;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81(local_168,0);
        local_e0[0x19] = (undefined1)((ulong)local_168 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_168 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_168 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_168 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_168 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_168 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_168 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_180;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        sVar9 = 0xbf;
        local_180 = (string *)(local_134 + 0xc);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4928a,
                   (size_t)&TmpS,0xbf,local_e0,"std::string(ZeroArray,ZeroArray+32)",local_58);
        boost::detail::shared_count::~shared_count(&sStack_68.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),
                          local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != &aStack_f0) {
          operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
        }
        DataStream::read((DataStream *)local_1a8,(int)&TmpL,(void *)0x20,sVar9);
        local_5a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_5a0 = "";
        local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_28.m_end = (iterator)0xc1;
        file_28.m_begin = (iterator)&local_5a8;
        msg_28.m_end = pvVar11;
        msg_28.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_5b8
                   ,msg_28);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        auVar24[0] = -(ZeroL[0x10] == TmpL.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar24[1] = -(ZeroL[0x11] == TmpL.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar24[2] = -(ZeroL[0x12] == TmpL.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar24[3] = -(ZeroL[0x13] == TmpL.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar24[4] = -(ZeroL[0x14] == TmpL.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar24[5] = -(ZeroL[0x15] == TmpL.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar24[6] = -(ZeroL[0x16] == TmpL.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar24[7] = -(ZeroL[0x17] == TmpL.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar24[8] = -(ZeroL[0x18] == TmpL.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar24[9] = -(ZeroL[0x19] == TmpL.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar24[10] = -(ZeroL[0x1a] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar24[0xb] = -(ZeroL[0x1b] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar24[0xc] = -(ZeroL[0x1c] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar24[0xd] = -(ZeroL[0x1d] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar24[0xe] = -(ZeroL[0x1e] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar24[0xf] = -(ZeroL[0x1f] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar15[0] = -(ZeroL[0] == TmpL.super_base_blob<256U>.m_data._M_elems[0]);
        auVar15[1] = -(ZeroL[1] == TmpL.super_base_blob<256U>.m_data._M_elems[1]);
        auVar15[2] = -(ZeroL[2] == TmpL.super_base_blob<256U>.m_data._M_elems[2]);
        auVar15[3] = -(ZeroL[3] == TmpL.super_base_blob<256U>.m_data._M_elems[3]);
        auVar15[4] = -(ZeroL[4] == TmpL.super_base_blob<256U>.m_data._M_elems[4]);
        auVar15[5] = -(ZeroL[5] == TmpL.super_base_blob<256U>.m_data._M_elems[5]);
        auVar15[6] = -(ZeroL[6] == TmpL.super_base_blob<256U>.m_data._M_elems[6]);
        auVar15[7] = -(ZeroL[7] == TmpL.super_base_blob<256U>.m_data._M_elems[7]);
        auVar15[8] = -(ZeroL[8] == TmpL.super_base_blob<256U>.m_data._M_elems[8]);
        auVar15[9] = -(ZeroL[9] == TmpL.super_base_blob<256U>.m_data._M_elems[9]);
        auVar15[10] = -(ZeroL[10] == TmpL.super_base_blob<256U>.m_data._M_elems[10]);
        auVar15[0xb] = -(ZeroL[0xb] == TmpL.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar15[0xc] = -(ZeroL[0xc] == TmpL.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar15[0xd] = -(ZeroL[0xd] == TmpL.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar15[0xe] = -(ZeroL[0xe] == TmpL.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar15[0xf] = -(ZeroL[0xf] == TmpL.super_base_blob<256U>.m_data._M_elems[0xf]);
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        auVar15 = auVar15 & auVar24;
        local_100[0] = (class_property<bool>)
                       (class_property<bool>)
                       ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_100._8_8_ = (element_type *)0x0;
        aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
        local_128._M_dataplus._M_p._0_1_ = 0x67;
        local_128._M_dataplus._M_p._1_7_ = 0xf48b;
        local_128._M_string_length = 0xf48bcd;
        local_70 = (undefined1  [8])ZeroL;
        local_e0[8] = '\0';
        local_e0[0] = '\0';
        local_e0[1] = 0x9a;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81((assertion_result *)local_70,0);
        local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01389a00;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = &TmpL;
        local_48._8_8_ = &TmpS;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xe37300,
                   (size_t)(local_134 + 0xc),0xc1,local_e0,"TmpL",local_58);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity)
        ;
        uVar3 = local_1a8._0_8_;
        if (local_1a8._8_8_ != local_1a8._0_8_) {
          local_1a8._8_8_ = local_1a8._0_8_;
        }
        local_198._8_8_ = 0;
        std::vector<std::byte,zero_after_free_allocator<std::byte>>::
        _M_range_insert<std::byte_const*>
                  ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_1a8,uVar3,MaxL,
                   MaxS);
        local_5c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_5c0 = "";
        local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_29.m_end = (iterator)0xc4;
        file_29.m_begin = (iterator)&local_5c8;
        msg_29.m_end = pvVar11;
        msg_29.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_5d8
                   ,msg_29);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_100._0_8_ = &aStack_f0;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)local_100,local_1a8._0_8_ + local_198._8_8_,local_1a8._8_8_);
        local_128._M_dataplus._M_p._0_1_ = SUB81(&local_128.field_2,0);
        local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_128.field_2 >> 8);
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)(local_134 + 0xc),MaxArray,0xf49da0);
        if (local_100._8_8_ == local_128._M_string_length) {
          if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
            rVar12.super_class_property<bool>.value = (class_property<bool>)true;
          }
          else {
            iVar6 = bcmp((void *)local_100._0_8_,
                         (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                          local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
            rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
          }
        }
        else {
          rVar12.super_class_property<bool>.value = (class_property<bool>)false;
        }
        local_70[0] = rVar12.super_class_property<bool>.value;
        sStack_68.px = (element_type *)0x0;
        sStack_68.pn.pi_ = (sp_counted_base *)0x0;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b9687d;
        TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
             + 0x66;
        local_168._0_8_ = (string *)local_100;
        local_e0[8] = '\0';
        local_e0[0] = 200;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81(local_168,0);
        local_e0[0x19] = (undefined1)((ulong)local_168 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_168 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_168 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_168 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_168 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_168 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_168 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_180;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        sVar9 = 0xc4;
        local_180 = (string *)(local_134 + 0xc);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4928a,
                   (size_t)&TmpS,0xc4,local_e0,"std::string(MaxArray,MaxArray+32)",local_58);
        boost::detail::shared_count::~shared_count(&sStack_68.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),
                          local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != &aStack_f0) {
          operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
        }
        DataStream::read((DataStream *)local_1a8,(int)&TmpL,(void *)0x20,sVar9);
        local_5e8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_5e0 = "";
        local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_30.m_end = (iterator)0xc6;
        file_30.m_begin = (iterator)&local_5e8;
        msg_30.m_end = pvVar11;
        msg_30.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_5f8
                   ,msg_30);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        auVar25[0] = -(MaxL[0x10] == TmpL.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar25[1] = -(MaxL[0x11] == TmpL.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar25[2] = -(MaxL[0x12] == TmpL.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar25[3] = -(MaxL[0x13] == TmpL.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar25[4] = -(MaxL[0x14] == TmpL.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar25[5] = -(MaxL[0x15] == TmpL.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar25[6] = -(MaxL[0x16] == TmpL.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar25[7] = -(MaxL[0x17] == TmpL.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar25[8] = -(MaxL[0x18] == TmpL.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar25[9] = -(MaxL[0x19] == TmpL.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar25[10] = -(MaxL[0x1a] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar25[0xb] = -(MaxL[0x1b] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar25[0xc] = -(MaxL[0x1c] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar25[0xd] = -(MaxL[0x1d] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar25[0xe] = -(MaxL[0x1e] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar25[0xf] = -(MaxL[0x1f] == TmpL.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar16[0] = -(MaxL[0] == TmpL.super_base_blob<256U>.m_data._M_elems[0]);
        auVar16[1] = -(MaxL[1] == TmpL.super_base_blob<256U>.m_data._M_elems[1]);
        auVar16[2] = -(MaxL[2] == TmpL.super_base_blob<256U>.m_data._M_elems[2]);
        auVar16[3] = -(MaxL[3] == TmpL.super_base_blob<256U>.m_data._M_elems[3]);
        auVar16[4] = -(MaxL[4] == TmpL.super_base_blob<256U>.m_data._M_elems[4]);
        auVar16[5] = -(MaxL[5] == TmpL.super_base_blob<256U>.m_data._M_elems[5]);
        auVar16[6] = -(MaxL[6] == TmpL.super_base_blob<256U>.m_data._M_elems[6]);
        auVar16[7] = -(MaxL[7] == TmpL.super_base_blob<256U>.m_data._M_elems[7]);
        auVar16[8] = -(MaxL[8] == TmpL.super_base_blob<256U>.m_data._M_elems[8]);
        auVar16[9] = -(MaxL[9] == TmpL.super_base_blob<256U>.m_data._M_elems[9]);
        auVar16[10] = -(MaxL[10] == TmpL.super_base_blob<256U>.m_data._M_elems[10]);
        auVar16[0xb] = -(MaxL[0xb] == TmpL.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar16[0xc] = -(MaxL[0xc] == TmpL.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar16[0xd] = -(MaxL[0xd] == TmpL.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar16[0xe] = -(MaxL[0xe] == TmpL.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar16[0xf] = -(MaxL[0xf] == TmpL.super_base_blob<256U>.m_data._M_elems[0xf]);
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        auVar16 = auVar16 & auVar25;
        local_100[0] = (class_property<bool>)
                       (class_property<bool>)
                       ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff);
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_100._8_8_ = (element_type *)0x0;
        aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
        local_128._M_dataplus._M_p._0_1_ = 0x67;
        local_128._M_dataplus._M_p._1_7_ = 0xf48b;
        local_128._M_string_length = 0xf48bcd;
        local_70 = (undefined1  [8])MaxL;
        local_e0[8] = '\0';
        local_e0[0] = '\0';
        local_e0[1] = 0x9a;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81((assertion_result *)local_70,0);
        local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01389a00;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = &TmpL;
        local_48._8_8_ = &TmpS;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xe37860,
                   (size_t)(local_134 + 0xc),0xc6,local_e0,"TmpL",local_58);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity)
        ;
        if (local_1a8._8_8_ != local_1a8._0_8_) {
          local_1a8._8_8_ = local_1a8._0_8_;
        }
        local_198._8_8_ = 0;
        local_608 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_600 = "";
        local_618 = &boost::unit_test::basic_cstring<char_const>::null;
        local_610 = &boost::unit_test::basic_cstring<char_const>::null;
        file_31.m_end = (iterator)0xc9;
        file_31.m_begin = (iterator)&local_608;
        msg_31.m_end = pvVar11;
        msg_31.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_618
                   ,msg_31);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        base_blob<160u>::GetHex_abi_cxx11_((string *)local_100,R1S);
        base_blob<160u>::ToString_abi_cxx11_((string *)(local_134 + 0xc),R1S);
        if (local_100._8_8_ == local_128._M_string_length) {
          if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
            rVar12.super_class_property<bool>.value = (class_property<bool>)true;
          }
          else {
            iVar6 = bcmp((void *)local_100._0_8_,
                         (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                          local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
            rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
          }
        }
        else {
          rVar12.super_class_property<bool>.value = (class_property<bool>)false;
        }
        local_70[0] = rVar12.super_class_property<bool>.value;
        sStack_68.px = (element_type *)0x0;
        sStack_68.pn.pi_ = (sp_counted_base *)0x0;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b9687d;
        TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
             + 0x66;
        local_168._0_8_ = (string *)local_100;
        local_e0[8] = '\0';
        local_e0[0] = 200;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81(local_168,0);
        local_e0[0x19] = (undefined1)((ulong)local_168 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_168 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_168 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_168 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_168 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_168 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_168 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_180;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        local_180 = (string *)(local_134 + 0xc);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf492f9,
                   (size_t)&TmpS,0xc9,local_e0,"R1S.ToString()",local_58);
        boost::detail::shared_count::~shared_count(&sStack_68.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),
                          local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != &aStack_f0) {
          operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
        }
        local_628 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_620 = "";
        local_638 = &boost::unit_test::basic_cstring<char_const>::null;
        local_630 = &boost::unit_test::basic_cstring<char_const>::null;
        file_32.m_end = (iterator)0xca;
        file_32.m_begin = (iterator)&local_628;
        msg_32.m_end = pvVar11;
        msg_32.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_638
                   ,msg_32);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        base_blob<160u>::GetHex_abi_cxx11_((string *)local_100,R2S);
        base_blob<160u>::ToString_abi_cxx11_((string *)(local_134 + 0xc),R2S);
        if (local_100._8_8_ == local_128._M_string_length) {
          if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
            rVar12.super_class_property<bool>.value = (class_property<bool>)true;
          }
          else {
            iVar6 = bcmp((void *)local_100._0_8_,
                         (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                          local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
            rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
          }
        }
        else {
          rVar12.super_class_property<bool>.value = (class_property<bool>)false;
        }
        local_70[0] = rVar12.super_class_property<bool>.value;
        sStack_68.px = (element_type *)0x0;
        sStack_68.pn.pi_ = (sp_counted_base *)0x0;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b9687d;
        TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
             + 0x66;
        local_168._0_8_ = (string *)local_100;
        local_e0[8] = '\0';
        local_e0[0] = 200;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81(local_168,0);
        local_e0[0x19] = (undefined1)((ulong)local_168 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_168 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_168 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_168 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_168 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_168 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_168 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_180;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        local_180 = (string *)(local_134 + 0xc);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49306,
                   (size_t)&TmpS,0xca,local_e0,"R2S.ToString()",local_58);
        boost::detail::shared_count::~shared_count(&sStack_68.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),
                          local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != &aStack_f0) {
          operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
        }
        local_648 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_640 = "";
        local_658 = &boost::unit_test::basic_cstring<char_const>::null;
        local_650 = &boost::unit_test::basic_cstring<char_const>::null;
        file_33.m_end = (iterator)0xcb;
        file_33.m_begin = (iterator)&local_648;
        msg_33.m_end = pvVar11;
        msg_33.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_658
                   ,msg_33);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        base_blob<160u>::GetHex_abi_cxx11_((string *)local_100,OneS);
        base_blob<160u>::ToString_abi_cxx11_((string *)(local_134 + 0xc),OneS);
        if (local_100._8_8_ == local_128._M_string_length) {
          if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
            rVar12.super_class_property<bool>.value = (class_property<bool>)true;
          }
          else {
            iVar6 = bcmp((void *)local_100._0_8_,
                         (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                          local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
            rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
          }
        }
        else {
          rVar12.super_class_property<bool>.value = (class_property<bool>)false;
        }
        local_70[0] = rVar12.super_class_property<bool>.value;
        sStack_68.px = (element_type *)0x0;
        sStack_68.pn.pi_ = (sp_counted_base *)0x0;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b9687d;
        TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
             + 0x66;
        local_168._0_8_ = (string *)local_100;
        local_e0[8] = '\0';
        local_e0[0] = 200;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81(local_168,0);
        local_e0[0x19] = (undefined1)((ulong)local_168 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_168 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_168 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_168 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_168 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_168 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_168 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_180;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        local_180 = (string *)(local_134 + 0xc);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49313,
                   (size_t)&TmpS,0xcb,local_e0,"OneS.ToString()",local_58);
        boost::detail::shared_count::~shared_count(&sStack_68.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),
                          local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != &aStack_f0) {
          operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
        }
        local_668 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_660 = "";
        local_678 = &boost::unit_test::basic_cstring<char_const>::null;
        local_670 = &boost::unit_test::basic_cstring<char_const>::null;
        file_34.m_end = (iterator)0xcc;
        file_34.m_begin = (iterator)&local_668;
        msg_34.m_end = pvVar11;
        msg_34.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_678
                   ,msg_34);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        base_blob<160u>::GetHex_abi_cxx11_((string *)local_100,MaxS);
        base_blob<160u>::ToString_abi_cxx11_((string *)(local_134 + 0xc),MaxS);
        if (local_100._8_8_ == local_128._M_string_length) {
          if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
            rVar12.super_class_property<bool>.value = (class_property<bool>)true;
          }
          else {
            iVar6 = bcmp((void *)local_100._0_8_,
                         (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                          local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
            rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
          }
        }
        else {
          rVar12.super_class_property<bool>.value = (class_property<bool>)false;
        }
        local_70[0] = rVar12.super_class_property<bool>.value;
        sStack_68.px = (element_type *)0x0;
        sStack_68.pn.pi_ = (sp_counted_base *)0x0;
        TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b9687d;
        TmpS.super_base_blob<160U>.m_data._M_elems._8_8_ =
             (long)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
             + 0x66;
        local_168._0_8_ = (string *)local_100;
        local_e0[8] = '\0';
        local_e0[0] = 200;
        local_e0[1] = 0x8f;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81(local_168,0);
        local_e0[0x19] = (undefined1)((ulong)local_168 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_168 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_168 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_168 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_168 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_168 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_168 >> 0x38);
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = &local_180;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        local_180 = (string *)(local_134 + 0xc);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49321,
                   (size_t)&TmpS,0xcc,local_e0,"MaxS.ToString()",local_58);
        boost::detail::shared_count::~shared_count(&sStack_68.pn);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
            &local_128.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                      local_128._M_dataplus._M_p._0_1_),
                          local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._0_8_ != &aStack_f0) {
          operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
        }
        TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = R1S[0x10];
        TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = R1S[0x11];
        TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = R1S[0x12];
        TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = R1S[0x13];
        TmpS.super_base_blob<160U>.m_data._M_elems[1] = R1S[1];
        TmpS.super_base_blob<160U>.m_data._M_elems[0] = R1S[0];
        TmpS.super_base_blob<160U>.m_data._M_elems[2] = R1S[2];
        TmpS.super_base_blob<160U>.m_data._M_elems[3] = R1S[3];
        TmpS.super_base_blob<160U>.m_data._M_elems[4] = R1S[4];
        TmpS.super_base_blob<160U>.m_data._M_elems[5] = R1S[5];
        TmpS.super_base_blob<160U>.m_data._M_elems[6] = R1S[6];
        TmpS.super_base_blob<160U>.m_data._M_elems[7] = R1S[7];
        TmpS.super_base_blob<160U>.m_data._M_elems[9] = R1S[9];
        TmpS.super_base_blob<160U>.m_data._M_elems[8] = R1S[8];
        TmpS.super_base_blob<160U>.m_data._M_elems[10] = R1S[10];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = R1S[0xb];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = R1S[0xc];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = R1S[0xd];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = R1S[0xe];
        TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = R1S[0xf];
        local_688 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_680 = "";
        local_698 = &boost::unit_test::basic_cstring<char_const>::null;
        local_690 = &boost::unit_test::basic_cstring<char_const>::null;
        file_35.m_end = (iterator)0xce;
        file_35.m_begin = (iterator)&local_688;
        msg_35.m_end = pvVar11;
        msg_35.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_698
                   ,msg_35);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        auVar17[0] = -(R1S[0] == TmpS.super_base_blob<160U>.m_data._M_elems[0]);
        auVar17[1] = -(R1S[1] == TmpS.super_base_blob<160U>.m_data._M_elems[1]);
        auVar17[2] = -(R1S[2] == TmpS.super_base_blob<160U>.m_data._M_elems[2]);
        auVar17[3] = -(R1S[3] == TmpS.super_base_blob<160U>.m_data._M_elems[3]);
        auVar17[4] = -(R1S[4] == TmpS.super_base_blob<160U>.m_data._M_elems[4]);
        auVar17[5] = -(R1S[5] == TmpS.super_base_blob<160U>.m_data._M_elems[5]);
        auVar17[6] = -(R1S[6] == TmpS.super_base_blob<160U>.m_data._M_elems[6]);
        auVar17[7] = -(R1S[7] == TmpS.super_base_blob<160U>.m_data._M_elems[7]);
        auVar17[8] = -(R1S[8] == TmpS.super_base_blob<160U>.m_data._M_elems[8]);
        auVar17[9] = -(R1S[9] == TmpS.super_base_blob<160U>.m_data._M_elems[9]);
        auVar17[10] = -(R1S[10] == TmpS.super_base_blob<160U>.m_data._M_elems[10]);
        auVar17[0xb] = -(R1S[0xb] == TmpS.super_base_blob<160U>.m_data._M_elems[0xb]);
        auVar17[0xc] = -(R1S[0xc] == TmpS.super_base_blob<160U>.m_data._M_elems[0xc]);
        auVar17[0xd] = -(R1S[0xd] == TmpS.super_base_blob<160U>.m_data._M_elems[0xd]);
        auVar17[0xe] = -(R1S[0xe] == TmpS.super_base_blob<160U>.m_data._M_elems[0xe]);
        auVar17[0xf] = -(R1S[0xf] == TmpS.super_base_blob<160U>.m_data._M_elems[0xf]);
        auVar31[0] = -(R1S[0x10] == TmpS.super_base_blob<160U>.m_data._M_elems[0x10]);
        auVar31[1] = -(R1S[0x11] == TmpS.super_base_blob<160U>.m_data._M_elems[0x11]);
        auVar31[2] = -(R1S[0x12] == TmpS.super_base_blob<160U>.m_data._M_elems[0x12]);
        auVar31[3] = -(R1S[0x13] == TmpS.super_base_blob<160U>.m_data._M_elems[0x13]);
        auVar31[4] = 0xff;
        auVar31[5] = 0xff;
        auVar31[6] = 0xff;
        auVar31[7] = 0xff;
        auVar31[8] = 0xff;
        auVar31[9] = 0xff;
        auVar31[10] = 0xff;
        auVar31[0xb] = 0xff;
        auVar31[0xc] = 0xff;
        auVar31[0xd] = 0xff;
        auVar31[0xe] = 0xff;
        auVar31[0xf] = 0xff;
        auVar17 = auVar17 & auVar31;
        local_100[0] = (class_property<bool>)
                       (class_property<bool>)
                       ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
        local_100._8_8_ = (element_type *)0x0;
        aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
        local_128._M_dataplus._M_p._0_1_ = 0x67;
        local_128._M_dataplus._M_p._1_7_ = 0xf48b;
        local_128._M_string_length = 0xf48bcd;
        local_e0[8] = '\0';
        local_e0[0] = 0x80;
        local_e0[1] = 0xe3;
        local_e0[2] = '8';
        local_e0[3] = '\x01';
        local_e0[4] = '\0';
        local_e0[5] = '\0';
        local_e0[6] = '\0';
        local_e0[7] = '\0';
        local_e0[0x10] = '8';
        local_e0[0x11] = 0xd1;
        local_e0[0x12] = '9';
        local_e0[0x13] = '\x01';
        local_e0[0x14] = '\0';
        local_e0[0x15] = '\0';
        local_e0[0x16] = '\0';
        local_e0[0x17] = '\0';
        local_e0[0x18] = SUB81((assertion_result *)local_70,0);
        local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
        local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
        local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
        local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
        local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
        local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
        local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
        local_168._0_8_ = R1S;
        local_58[8] = '\0';
        local_58._0_8_ = &PTR__lazy_ostream_0138e380;
        local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = local_168;
        pvVar10 = (iterator)0x1;
        pvVar11 = (iterator)0x2;
        local_70 = (undefined1  [8])&TmpS;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf48f33,
                   (size_t)(local_134 + 0xc),0xce,local_e0,"R1S",local_58);
        boost::detail::shared_count::~shared_count((shared_count *)&aStack_f0._M_allocated_capacity)
        ;
        local_6a8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_6a0 = "";
        ppuVar7 = &local_6b8;
        local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_36.m_end = (iterator)0xcf;
        file_36.m_begin = (iterator)&local_6a8;
        msg_36.m_end = pvVar11;
        msg_36.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)ppuVar7,
                   msg_36);
        local_b8._8_8_ = local_b8._9_8_ << 8;
        local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
        apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
        apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        base_blob<160u>::ToString_abi_cxx11_((string *)local_100,R2S);
        str_03._M_str = (char *)ppuVar7;
        str_03._M_len = local_100._0_8_;
        detail::FromHex<uint160>((optional<uint160> *)local_70,(detail *)local_100._8_8_,str_03);
        if (sStack_68.pn.pi_._4_1_ == '\0') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          auVar26[0] = -(R2S[0] == (class_property<bool>)local_70[0]);
          auVar26[1] = -(R2S[1] == local_70[1]);
          auVar26[2] = -(R2S[2] == local_70[2]);
          auVar26[3] = -(R2S[3] == local_70[3]);
          auVar26[4] = -(R2S[4] == local_70[4]);
          auVar26[5] = -(R2S[5] == local_70[5]);
          auVar26[6] = -(R2S[6] == local_70[6]);
          auVar26[7] = -(R2S[7] == local_70[7]);
          auVar26[8] = -(R2S[8] == sStack_68.px._0_1_);
          auVar26[9] = -(R2S[9] == sStack_68.px._1_1_);
          auVar26[10] = -(R2S[10] == sStack_68.px._2_1_);
          auVar26[0xb] = -(R2S[0xb] == sStack_68.px._3_1_);
          auVar26[0xc] = -(R2S[0xc] == sStack_68.px._4_1_);
          auVar26[0xd] = -(R2S[0xd] == sStack_68.px._5_1_);
          auVar26[0xe] = -(R2S[0xe] == sStack_68.px._6_1_);
          auVar26[0xf] = -(R2S[0xf] == sStack_68.px._7_1_);
          auVar32[0] = -(R2S[0x10] == (char)sStack_68.pn.pi_);
          auVar32[1] = -(R2S[0x11] == sStack_68.pn.pi_._1_1_);
          auVar32[2] = -(R2S[0x12] == sStack_68.pn.pi_._2_1_);
          auVar32[3] = -(R2S[0x13] == sStack_68.pn.pi_._3_1_);
          auVar32[4] = 0xff;
          auVar32[5] = 0xff;
          auVar32[6] = 0xff;
          auVar32[7] = 0xff;
          auVar32[8] = 0xff;
          auVar32[9] = 0xff;
          auVar32[10] = 0xff;
          auVar32[0xb] = 0xff;
          auVar32[0xc] = 0xff;
          auVar32[0xd] = 0xff;
          auVar32[0xe] = 0xff;
          auVar32[0xf] = 0xff;
          auVar32 = auVar32 & auVar26;
          local_128._M_dataplus._M_p._0_1_ =
               (ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff;
          local_128._M_string_length = 0;
          local_128.field_2._M_allocated_capacity = 0;
          local_168._8_8_ = "";
          local_168._0_8_ =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
          ;
          local_e0[8] = '\0';
          local_e0[0] = 0x80;
          local_e0[1] = 0xe3;
          local_e0[2] = '8';
          local_e0[3] = '\x01';
          local_e0[4] = '\0';
          local_e0[5] = '\0';
          local_e0[6] = '\0';
          local_e0[7] = '\0';
          local_e0[0x10] = '8';
          local_e0[0x11] = 0xd1;
          local_e0[0x12] = '9';
          local_e0[0x13] = '\x01';
          local_e0[0x14] = '\0';
          local_e0[0x15] = '\0';
          local_e0[0x16] = '\0';
          local_e0[0x17] = '\0';
          local_e0[0x18] = SUB81(&local_180,0);
          local_e0[0x19] = (undefined1)((ulong)&local_180 >> 8);
          local_e0[0x1a] = (undefined1)((ulong)&local_180 >> 0x10);
          local_e0[0x1b] = (undefined1)((ulong)&local_180 >> 0x18);
          local_e0[0x1c] = (undefined1)((ulong)&local_180 >> 0x20);
          local_e0[0x1d] = (undefined1)((ulong)&local_180 >> 0x28);
          local_e0[0x1e] = (undefined1)((ulong)&local_180 >> 0x30);
          local_e0[0x1f] = (undefined1)((ulong)&local_180 >> 0x38);
          local_48._8_8_ = local_170;
          local_170 = (undefined1  [8])R2S;
          local_58[8] = '\0';
          local_58._0_8_ = &PTR__lazy_ostream_0138e380;
          local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
          pvVar10 = (iterator)0x1;
          pvVar11 = (iterator)0x2;
          local_180 = (string *)local_70;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)(local_134 + 0xc),(lazy_ostream *)local_b8,1,2,REQUIRE,
                     0xf48e15,(size_t)local_168,0xcf,local_e0,"R2S",local_58);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&local_128.field_2._M_allocated_capacity);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._0_8_ != &aStack_f0) {
            operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
          }
          local_6c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
          ;
          local_6c0 = "";
          ppuVar7 = &local_6d8;
          local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_37.m_end = (iterator)0xd0;
          file_37.m_begin = (iterator)&local_6c8;
          msg_37.m_end = pvVar11;
          msg_37.m_begin = pvVar10;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)ppuVar7,
                     msg_37);
          local_b8._8_8_ = local_b8._9_8_ << 8;
          local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
          apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
          apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
          base_blob<160u>::ToString_abi_cxx11_((string *)local_100,ZeroS);
          str_04._M_str = (char *)ppuVar7;
          str_04._M_len = local_100._0_8_;
          detail::FromHex<uint160>((optional<uint160> *)local_70,(detail *)local_100._8_8_,str_04);
          if (sStack_68.pn.pi_._4_1_ == '\0') {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            local_168 = (undefined1  [16])0x0;
            local_158[0] = '\0';
            local_158[1] = '\0';
            local_158[2] = '\0';
            local_158[3] = '\0';
            auVar33[0] = -((char)sStack_68.pn.pi_ == '\0');
            auVar33[1] = -(sStack_68.pn.pi_._1_1_ == '\0');
            auVar33[2] = -(sStack_68.pn.pi_._2_1_ == '\0');
            auVar33[3] = -(sStack_68.pn.pi_._3_1_ == '\0');
            auVar33[4] = 0xff;
            auVar33[5] = 0xff;
            auVar33[6] = 0xff;
            auVar33[7] = 0xff;
            auVar33[8] = 0xff;
            auVar33[9] = 0xff;
            auVar33[10] = 0xff;
            auVar33[0xb] = 0xff;
            auVar33[0xc] = 0xff;
            auVar33[0xd] = 0xff;
            auVar33[0xe] = 0xff;
            auVar33[0xf] = 0xff;
            auVar27[0] = -((class_property<bool>)local_70[0] == false);
            auVar27[1] = -(local_70[1] == '\0');
            auVar27[2] = -(local_70[2] == '\0');
            auVar27[3] = -(local_70[3] == '\0');
            auVar27[4] = -(local_70[4] == '\0');
            auVar27[5] = -(local_70[5] == '\0');
            auVar27[6] = -(local_70[6] == '\0');
            auVar27[7] = -(local_70[7] == '\0');
            auVar27[8] = -(sStack_68.px._0_1_ == '\0');
            auVar27[9] = -(sStack_68.px._1_1_ == '\0');
            auVar27[10] = -(sStack_68.px._2_1_ == '\0');
            auVar27[0xb] = -(sStack_68.px._3_1_ == '\0');
            auVar27[0xc] = -(sStack_68.px._4_1_ == '\0');
            auVar27[0xd] = -(sStack_68.px._5_1_ == '\0');
            auVar27[0xe] = -(sStack_68.px._6_1_ == '\0');
            auVar27[0xf] = -(sStack_68.px._7_1_ == '\0');
            auVar27 = auVar27 & auVar33;
            local_128._M_dataplus._M_p._0_1_ =
                 (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff;
            local_128._M_string_length = 0;
            local_128.field_2._M_allocated_capacity = 0;
            local_180 = (string *)0xf48b67;
            local_178 = "";
            local_170 = (undefined1  [8])local_70;
            local_e0[8] = '\0';
            local_e0[0] = 0x80;
            local_e0[1] = 0xe3;
            local_e0[2] = '8';
            local_e0[3] = '\x01';
            local_e0[4] = '\0';
            local_e0[5] = '\0';
            local_e0[6] = '\0';
            local_e0[7] = '\0';
            local_e0[0x10] = '8';
            local_e0[0x11] = 0xd1;
            local_e0[0x12] = '9';
            local_e0[0x13] = '\x01';
            local_e0[0x14] = '\0';
            local_e0[0x15] = '\0';
            local_e0[0x16] = '\0';
            local_e0[0x17] = '\0';
            local_e0[0x18] = SUB81(local_170,0);
            local_e0[0x19] = (undefined1)((ulong)local_170 >> 8);
            local_e0[0x1a] = (undefined1)((ulong)local_170 >> 0x10);
            local_e0[0x1b] = (undefined1)((ulong)local_170 >> 0x18);
            local_e0[0x1c] = (undefined1)((ulong)local_170 >> 0x20);
            local_e0[0x1d] = (undefined1)((ulong)local_170 >> 0x28);
            local_e0[0x1e] = (undefined1)((ulong)local_170 >> 0x30);
            local_e0[0x1f] = (undefined1)((ulong)local_170 >> 0x38);
            local_48._8_8_ = &local_188;
            local_58[8] = '\0';
            local_58._0_8_ = &PTR__lazy_ostream_0138e380;
            local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
            pvVar10 = (iterator)0x1;
            pvVar11 = (iterator)0x2;
            pcVar8 = (char *)0xd0;
            local_188 = local_168;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)(local_134 + 0xc),(lazy_ostream *)local_b8,1,2,REQUIRE,
                       0xf48e3e,(size_t)&local_180,0xd0,local_e0,"uint160()",local_58);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&local_128.field_2._M_allocated_capacity);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._0_8_ != &aStack_f0) {
              operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1));
            }
            base_blob<160u>::ToString_abi_cxx11_((string *)local_e0,R1S);
            str_05._M_len._1_1_ = local_e0[1];
            str_05._M_len._0_1_ = local_e0[0];
            str_05._M_len._2_1_ = local_e0[2];
            str_05._M_len._3_1_ = local_e0[3];
            str_05._M_len._4_1_ = local_e0[4];
            str_05._M_len._5_1_ = local_e0[5];
            str_05._M_len._6_1_ = local_e0[6];
            str_05._M_len._7_1_ = local_e0[7];
            str_05._M_str = pcVar8;
            detail::FromHex<uint160>
                      ((optional<uint160> *)local_58,
                       (detail *)
                       CONCAT17(local_e0[0xf],
                                CONCAT16(local_e0[0xe],
                                         CONCAT15(local_e0[0xd],
                                                  CONCAT14(local_e0[0xc],
                                                           CONCAT13(local_e0[0xb],
                                                                    CONCAT12(local_e0[10],
                                                                             CONCAT11(local_e0[9],
                                                                                      local_e0[8])))
                                                          )))),str_05);
            uVar3 = local_48._M_allocated_capacity;
            if (local_48._M_local_buf[4] == '\0') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = local_48._M_local_buf[0];
              TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = local_48._M_local_buf[1];
              TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = local_48._M_local_buf[2];
              TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = local_48._M_local_buf[3];
              TmpS.super_base_blob<160U>.m_data._M_elems._9_7_ = local_58._9_7_;
              TmpS.super_base_blob<160U>.m_data._M_elems[8] = local_58[8];
              TmpS.super_base_blob<160U>.m_data._M_elems[0] = local_58[0];
              TmpS.super_base_blob<160U>.m_data._M_elems[1] = local_58[1];
              TmpS.super_base_blob<160U>.m_data._M_elems[2] = local_58[2];
              TmpS.super_base_blob<160U>.m_data._M_elems[3] = local_58[3];
              TmpS.super_base_blob<160U>.m_data._M_elems[4] = local_58[4];
              TmpS.super_base_blob<160U>.m_data._M_elems[5] = local_58[5];
              TmpS.super_base_blob<160U>.m_data._M_elems[6] = local_58[6];
              TmpS.super_base_blob<160U>.m_data._M_elems[7] = local_58[7];
              puVar1 = (undefined1 *)
                       CONCAT17(local_e0[7],
                                CONCAT16(local_e0[6],
                                         CONCAT15(local_e0[5],
                                                  CONCAT14(local_e0[4],
                                                           CONCAT13(local_e0[3],
                                                                    CONCAT12(local_e0[2],
                                                                             CONCAT11(local_e0[1],
                                                                                      local_e0[0])))
                                                          ))));
              local_48._M_allocated_capacity = uVar3;
              if (puVar1 != local_e0 + 0x10) {
                operator_delete(puVar1,CONCAT17(local_e0[0x17],
                                                CONCAT16(local_e0[0x16],
                                                         CONCAT15(local_e0[0x15],
                                                                  CONCAT14(local_e0[0x14],
                                                                           CONCAT13(local_e0[0x13],
                                                                                    CONCAT12(
                                                  local_e0[0x12],
                                                  CONCAT11(local_e0[0x11],local_e0[0x10]))))))) + 1)
                ;
              }
              local_6e8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_6e0 = "";
              local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_38.m_end = (iterator)0xd3;
              file_38.m_begin = (iterator)&local_6e8;
              msg_38.m_end = pvVar11;
              msg_38.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,
                         (size_t)&local_6f8,msg_38);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_58,(equal_coll_impl *)local_b8,R1S,&R2L,R1Array,
                         R1Array + 0x14);
              local_e0[8] = '\0';
              local_e0[0] = '\b';
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = 0xa1;
              local_e0[0x19] = 0xae;
              local_e0[0x1a] = 0xf4;
              local_e0[0x1b] = '\0';
              local_e0[0x1c] = '\0';
              local_e0[0x1d] = '\0';
              local_e0[0x1e] = '\0';
              local_e0[0x1f] = '\0';
              local_708 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_700 = "";
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf49339,
                         (size_t)&local_708,0xd3,"R1S.end()","R1Array","R1Array + uint160::size()");
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&local_48._M_allocated_capacity);
              local_718 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_710 = "";
              local_728 = &boost::unit_test::basic_cstring<char_const>::null;
              local_720 = &boost::unit_test::basic_cstring<char_const>::null;
              file_39.m_end = (iterator)0xd4;
              file_39.m_begin = (iterator)&local_718;
              msg_39.m_end = pvVar11;
              msg_39.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,
                         (size_t)&local_728,msg_39);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_58,(equal_coll_impl *)local_b8,(uchar *)&TmpS,
                         local_134,R1Array,R1Array + 0x14);
              local_e0[8] = '\0';
              local_e0[0] = '\b';
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = 0xa1;
              local_e0[0x19] = 0xae;
              local_e0[0x1a] = 0xf4;
              local_e0[0x1b] = '\0';
              local_e0[0x1c] = '\0';
              local_e0[0x1d] = '\0';
              local_e0[0x1e] = '\0';
              local_e0[0x1f] = '\0';
              local_738 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_730 = "";
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf49369,
                         (size_t)&local_738,0xd4,"TmpS.end()","R1Array","R1Array + uint160::size()")
              ;
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&local_48._M_allocated_capacity);
              local_748 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_740 = "";
              local_758 = &boost::unit_test::basic_cstring<char_const>::null;
              local_750 = &boost::unit_test::basic_cstring<char_const>::null;
              file_40.m_end = (iterator)0xd5;
              file_40.m_begin = (iterator)&local_748;
              msg_40.m_end = pvVar11;
              msg_40.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,
                         (size_t)&local_758,msg_40);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_58,(equal_coll_impl *)local_b8,R2S,ZeroL,R2Array,
                         R2Array + 0x14);
              local_e0[8] = '\0';
              local_e0[0] = '\b';
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = 0xa1;
              local_e0[0x19] = 0xae;
              local_e0[0x1a] = 0xf4;
              local_e0[0x1b] = '\0';
              local_e0[0x1c] = '\0';
              local_e0[0x1d] = '\0';
              local_e0[0x1e] = '\0';
              local_e0[0x1f] = '\0';
              local_768 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_760 = "";
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf49381,
                         (size_t)&local_768,0xd5,"R2S.end()","R2Array","R2Array + uint160::size()");
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&local_48._M_allocated_capacity);
              local_778 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_770 = "";
              local_788 = &boost::unit_test::basic_cstring<char_const>::null;
              local_780 = &boost::unit_test::basic_cstring<char_const>::null;
              file_41.m_end = (iterator)0xd6;
              file_41.m_begin = (iterator)&local_778;
              msg_41.m_end = pvVar11;
              msg_41.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,
                         (size_t)&local_788,msg_41);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_58,(equal_coll_impl *)local_b8,ZeroS,OneL,
                         ZeroArray,ZeroArray + 0x14);
              local_e0[8] = '\0';
              local_e0[0] = '\b';
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = 0xa1;
              local_e0[0x19] = 0xae;
              local_e0[0x1a] = 0xf4;
              local_e0[0x1b] = '\0';
              local_e0[0x1c] = '\0';
              local_e0[0x1d] = '\0';
              local_e0[0x1e] = '\0';
              local_e0[0x1f] = '\0';
              local_798 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_790 = "";
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf493b1,
                         (size_t)&local_798,0xd6,"ZeroS.end()","ZeroArray",
                         "ZeroArray + uint160::size()");
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&local_48._M_allocated_capacity);
              local_7a8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_7a0 = "";
              local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_42.m_end = (iterator)0xd7;
              file_42.m_begin = (iterator)&local_7a8;
              msg_42.m_end = pvVar11;
              msg_42.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,
                         (size_t)&local_7b8,msg_42);
              boost::test_tools::tt_detail::equal_coll_impl::operator()
                        ((assertion_result *)local_58,(equal_coll_impl *)local_b8,OneS,MaxL,OneArray
                         ,OneArray + 0x14);
              local_e0[8] = '\0';
              local_e0[0] = '\b';
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = 0xa1;
              local_e0[0x19] = 0xae;
              local_e0[0x1a] = 0xf4;
              local_e0[0x1b] = '\0';
              local_e0[0x1c] = '\0';
              local_e0[0x1d] = '\0';
              local_e0[0x1e] = '\0';
              local_e0[0x1f] = '\0';
              local_7c8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_7c0 = "";
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0xd;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_58,(lazy_ostream *)local_e0,1,0xd,4,0xf493e7,
                         (size_t)&local_7c8,0xd7,"OneS.end()","OneArray",
                         "OneArray + uint160::size()");
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&local_48._M_allocated_capacity);
              local_7d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_7d0 = "";
              local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_43.m_end = (iterator)0xd8;
              file_43.m_begin = (iterator)&local_7d8;
              msg_43.m_end = pvVar11;
              msg_43.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,
                         (size_t)&local_7e8,msg_43);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_170[0] = '\x14';
              local_170[1] = '\0';
              local_170[2] = '\0';
              local_170[3] = '\0';
              local_180 = (string *)0x14;
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])local_170;
              local_e0[8] = '\0';
              local_e0[0] = 0x88;
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_01388f48;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              local_168._0_8_ = &local_180;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4941a
                         ,(size_t)(local_134 + 0xc),0xd8,(lazy_ostream *)local_e0,"sizeof(R1S)",
                         local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_7f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_7f0 = "";
              local_808 = &boost::unit_test::basic_cstring<char_const>::null;
              local_800 = &boost::unit_test::basic_cstring<char_const>::null;
              file_44.m_end = (iterator)0xd9;
              file_44.m_begin = (iterator)&local_7f8;
              msg_44.m_end = pvVar11;
              msg_44.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,
                         (size_t)&local_808,msg_44);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)0x14;
              local_170[0] = '\x14';
              local_170[1] = '\0';
              local_170[2] = '\0';
              local_170[3] = '\0';
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 'H';
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_013890c8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49425
                         ,(size_t)(local_134 + 0xc),0xd9,(lazy_ostream *)local_e0,"20",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_818 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_810 = "";
              local_828 = &boost::unit_test::basic_cstring<char_const>::null;
              local_820 = &boost::unit_test::basic_cstring<char_const>::null;
              file_45.m_end = (iterator)0xda;
              file_45.m_begin = (iterator)&local_818;
              msg_45.m_end = pvVar11;
              msg_45.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,
                         (size_t)&local_828,msg_45);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180._0_1_ = '\x14';
              local_180._1_1_ = '\0';
              local_180._2_1_ = '\0';
              local_180._3_1_ = '\0';
              local_170[0] = '\x14';
              local_170[1] = '\0';
              local_170[2] = '\0';
              local_170[3] = '\0';
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 0x88;
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_013890c8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4941a
                         ,(size_t)(local_134 + 0xc),0xda,(lazy_ostream *)local_e0,"20",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_838 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_830 = "";
              local_848 = &boost::unit_test::basic_cstring<char_const>::null;
              local_840 = &boost::unit_test::basic_cstring<char_const>::null;
              file_46.m_end = (iterator)0xdb;
              file_46.m_begin = (iterator)&local_838;
              msg_46.m_end = pvVar11;
              msg_46.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,
                         (size_t)&local_848,msg_46);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180._0_1_ = '\x14';
              local_180._1_1_ = '\0';
              local_180._2_1_ = '\0';
              local_180._3_1_ = '\0';
              local_170[0] = '\x14';
              local_170[1] = '\0';
              local_170[2] = '\0';
              local_170[3] = '\0';
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 0x88;
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_013890c8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49431
                         ,(size_t)(local_134 + 0xc),0xdb,(lazy_ostream *)local_e0,"20",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_858 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_850 = "";
              local_868 = &boost::unit_test::basic_cstring<char_const>::null;
              local_860 = &boost::unit_test::basic_cstring<char_const>::null;
              file_47.m_end = (iterator)0xdc;
              file_47.m_begin = (iterator)&local_858;
              msg_47.m_end = pvVar11;
              msg_47.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,
                         (size_t)&local_868,msg_47);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180._0_1_ = '\x14';
              local_180._1_1_ = '\0';
              local_180._2_1_ = '\0';
              local_180._3_1_ = '\0';
              local_170[0] = '\x14';
              local_170[1] = '\0';
              local_170[2] = '\0';
              local_170[3] = '\0';
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 0x88;
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_013890c8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4943c
                         ,(size_t)(local_134 + 0xc),0xdc,(lazy_ostream *)local_e0,"20",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_878 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_870 = "";
              local_888 = &boost::unit_test::basic_cstring<char_const>::null;
              local_880 = &boost::unit_test::basic_cstring<char_const>::null;
              file_48.m_end = (iterator)0xdd;
              file_48.m_begin = (iterator)&local_878;
              msg_48.m_end = pvVar11;
              msg_48.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,
                         (size_t)&local_888,msg_48);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)CONCAT44(local_180._4_4_,0x14);
              local_170._0_4_ = 0x14;
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 0x88;
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_013890c8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49449
                         ,(size_t)(local_134 + 0xc),0xdd,(lazy_ostream *)local_e0,"20",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_898 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_890 = "";
              local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_49.m_end = (iterator)0xde;
              file_49.m_begin = (iterator)&local_898;
              msg_49.m_end = pvVar11;
              msg_49.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,
                         (size_t)&local_8a8,msg_49);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)&R2L;
              local_170 = (undefined1  [8])&R2L;
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 0xc0;
              local_e0[1] = 0xe3;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_0138e3c0;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49455
                         ,(size_t)(local_134 + 0xc),0xde,(lazy_ostream *)local_e0,"R1S.end()",
                         local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_8b8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_8b0 = "";
              local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_50.m_end = (iterator)0xdf;
              file_50.m_begin = (iterator)&local_8b8;
              msg_50.m_end = pvVar11;
              msg_50.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,
                         (size_t)&local_8c8,msg_50);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)ZeroL;
              local_170 = (undefined1  [8])ZeroL;
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 0xc0;
              local_e0[1] = 0xe3;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_0138e3c0;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49466
                         ,(size_t)(local_134 + 0xc),0xdf,(lazy_ostream *)local_e0,"R2S.end()",
                         local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_8d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_8d0 = "";
              local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_51.m_end = (iterator)0xe0;
              file_51.m_begin = (iterator)&local_8d8;
              msg_51.m_end = pvVar11;
              msg_51.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,
                         (size_t)&local_8e8,msg_51);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)MaxL;
              local_170 = (undefined1  [8])MaxL;
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 0xc0;
              local_e0[1] = 0xe3;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_0138e3c0;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49477
                         ,(size_t)(local_134 + 0xc),0xe0,(lazy_ostream *)local_e0,"OneS.end()",
                         local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_8f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_8f0 = "";
              local_908 = &boost::unit_test::basic_cstring<char_const>::null;
              local_900 = &boost::unit_test::basic_cstring<char_const>::null;
              file_52.m_end = (iterator)0xe1;
              file_52.m_begin = (iterator)&local_8f8;
              msg_52.m_end = pvVar11;
              msg_52.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,
                         (size_t)&local_908,msg_52);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)&basics_registrar633;
              local_170 = (undefined1  [8])&basics_registrar633;
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 0xc0;
              local_e0[1] = 0xe3;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_0138e3c0;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf49489
                         ,(size_t)(local_134 + 0xc),0xe1,(lazy_ostream *)local_e0,"MaxS.end()",
                         local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_918 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_910 = "";
              local_928 = &boost::unit_test::basic_cstring<char_const>::null;
              local_920 = &boost::unit_test::basic_cstring<char_const>::null;
              file_53.m_end = (iterator)0xe2;
              file_53.m_begin = (iterator)&local_918;
              msg_53.m_end = pvVar11;
              msg_53.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,
                         (size_t)&local_928,msg_53);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)local_134;
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = '\0';
              local_e0[1] = 0xe4;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_0138e400;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_170 = (undefined1  [8])local_180;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf494a6
                         ,(size_t)(local_134 + 0xc),0xe2,(lazy_ostream *)local_e0,"TmpS.end()",
                         local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_938 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_930 = "";
              local_948 = &boost::unit_test::basic_cstring<char_const>::null;
              local_940 = &boost::unit_test::basic_cstring<char_const>::null;
              file_54.m_end = (iterator)0xe3;
              file_54.m_begin = (iterator)&local_938;
              msg_54.m_end = pvVar11;
              msg_54.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,
                         (size_t)&local_948,msg_54);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)0x14;
              local_170[0] = '\x14';
              local_170[1] = '\0';
              local_170[2] = '\0';
              local_170[3] = '\0';
              local_100[0] = (class_property<bool>)0x1;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 'H';
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_013890c8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf494b8
                         ,(size_t)(local_134 + 0xc),0xe3,(lazy_ostream *)local_e0,"20",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              local_958 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_950 = "";
              local_968 = &boost::unit_test::basic_cstring<char_const>::null;
              local_960 = &boost::unit_test::basic_cstring<char_const>::null;
              file_55.m_end = (iterator)0xe4;
              file_55.m_begin = (iterator)&local_958;
              msg_55.m_end = pvVar11;
              msg_55.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,
                         (size_t)&local_968,msg_55);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_180 = (string *)0x14;
              local_170._0_4_ = 0x14;
              local_100[0] = (class_property<bool>)true;
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])&local_180;
              local_e0[8] = '\0';
              local_e0[0] = 'H';
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = local_170;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_013890c8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf494ce
                         ,(size_t)(local_134 + 0xc),0xe4,(lazy_ostream *)local_e0,"20",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              std::vector<std::byte,zero_after_free_allocator<std::byte>>::
              _M_range_insert<std::byte_const*>
                        ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_1a8,
                         local_1a8._8_8_,R1S,&R2L);
              local_978 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_970 = "";
              local_988 = &boost::unit_test::basic_cstring<char_const>::null;
              local_980 = &boost::unit_test::basic_cstring<char_const>::null;
              file_56.m_end = (iterator)0xe7;
              file_56.m_begin = (iterator)&local_978;
              msg_56.m_end = pvVar11;
              msg_56.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,
                         (size_t)&local_988,msg_56);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_100._0_8_ = &aStack_f0;
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)local_100,local_1a8._0_8_ + local_198._8_8_,local_1a8._8_8_);
              local_128._M_dataplus._M_p._0_1_ = SUB81(&local_128.field_2,0);
              local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_128.field_2 >> 8);
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)(local_134 + 0xc),R1Array,0xf49cd4);
              if (local_100._8_8_ == local_128._M_string_length) {
                if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
                  rVar12.super_class_property<bool>.value = (class_property<bool>)true;
                }
                else {
                  iVar6 = bcmp((void *)local_100._0_8_,
                               (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                                local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
                  rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
                }
              }
              else {
                rVar12.super_class_property<bool>.value = (class_property<bool>)false;
              }
              local_70[0] = rVar12.super_class_property<bool>.value;
              sStack_68.px = (element_type *)0x0;
              sStack_68.pn.pi_ = (sp_counted_base *)0x0;
              local_168._8_8_ = "";
              local_168._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_e0[8] = '\0';
              local_e0[0] = 200;
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(&local_180,0);
              local_e0[0x19] = (undefined1)((ulong)&local_180 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)&local_180 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)&local_180 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)&local_180 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)&local_180 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)&local_180 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)&local_180 >> 0x38);
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_48._8_8_ = local_170;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              sVar9 = 0xe7;
              local_180 = (string *)local_100;
              local_170 = (undefined1  [8])(local_134 + 0xc);
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4928a,
                         (size_t)local_168,0xe7,(lazy_ostream *)local_e0,
                         "std::string(R1Array,R1Array+20)",local_58);
              boost::detail::shared_count::~shared_count(&sStack_68.pn);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
                  &local_128.field_2) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                            local_128._M_dataplus._M_p._0_1_),
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._0_8_ != &aStack_f0) {
                operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1)
                               );
              }
              DataStream::read((DataStream *)local_1a8,(int)&TmpS,(void *)0x14,sVar9);
              local_998 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_990 = "";
              local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_57.m_end = (iterator)0xe9;
              file_57.m_begin = (iterator)&local_998;
              msg_57.m_end = pvVar11;
              msg_57.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,
                         (size_t)&local_9a8,msg_57);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              auVar18[0] = -(R1S[0] == TmpS.super_base_blob<160U>.m_data._M_elems[0]);
              auVar18[1] = -(R1S[1] == TmpS.super_base_blob<160U>.m_data._M_elems[1]);
              auVar18[2] = -(R1S[2] == TmpS.super_base_blob<160U>.m_data._M_elems[2]);
              auVar18[3] = -(R1S[3] == TmpS.super_base_blob<160U>.m_data._M_elems[3]);
              auVar18[4] = -(R1S[4] == TmpS.super_base_blob<160U>.m_data._M_elems[4]);
              auVar18[5] = -(R1S[5] == TmpS.super_base_blob<160U>.m_data._M_elems[5]);
              auVar18[6] = -(R1S[6] == TmpS.super_base_blob<160U>.m_data._M_elems[6]);
              auVar18[7] = -(R1S[7] == TmpS.super_base_blob<160U>.m_data._M_elems[7]);
              auVar18[8] = -(R1S[8] == TmpS.super_base_blob<160U>.m_data._M_elems[8]);
              auVar18[9] = -(R1S[9] == TmpS.super_base_blob<160U>.m_data._M_elems[9]);
              auVar18[10] = -(R1S[10] == TmpS.super_base_blob<160U>.m_data._M_elems[10]);
              auVar18[0xb] = -(R1S[0xb] == TmpS.super_base_blob<160U>.m_data._M_elems[0xb]);
              auVar18[0xc] = -(R1S[0xc] == TmpS.super_base_blob<160U>.m_data._M_elems[0xc]);
              auVar18[0xd] = -(R1S[0xd] == TmpS.super_base_blob<160U>.m_data._M_elems[0xd]);
              auVar18[0xe] = -(R1S[0xe] == TmpS.super_base_blob<160U>.m_data._M_elems[0xe]);
              auVar18[0xf] = -(R1S[0xf] == TmpS.super_base_blob<160U>.m_data._M_elems[0xf]);
              auVar34[0] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x10] == (uchar)R1S._16_4_);
              auVar34[1] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x11] == SUB41(R1S._16_4_,1)
                            );
              auVar34[2] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x12] == SUB41(R1S._16_4_,2)
                            );
              auVar34[3] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x13] == SUB41(R1S._16_4_,3)
                            );
              auVar34[4] = 0xff;
              auVar34[5] = 0xff;
              auVar34[6] = 0xff;
              auVar34[7] = 0xff;
              auVar34[8] = 0xff;
              auVar34[9] = 0xff;
              auVar34[10] = 0xff;
              auVar34[0xb] = 0xff;
              auVar34[0xc] = 0xff;
              auVar34[0xd] = 0xff;
              auVar34[0xe] = 0xff;
              auVar34[0xf] = 0xff;
              auVar18 = auVar18 & auVar34;
              local_100[0] = (class_property<bool>)
                             (class_property<bool>)
                             ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])R1S;
              local_e0[8] = '\0';
              local_e0[0] = 0x80;
              local_e0[1] = 0xe3;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81((assertion_result *)local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_0138e380;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              local_168._0_8_ = &TmpS;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf48cb4
                         ,(size_t)(local_134 + 0xc),0xe9,(lazy_ostream *)local_e0,"TmpS",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              uVar3 = local_1a8._0_8_;
              if (local_1a8._8_8_ != local_1a8._0_8_) {
                local_1a8._8_8_ = local_1a8._0_8_;
              }
              local_198._8_8_ = 0;
              std::vector<std::byte,zero_after_free_allocator<std::byte>>::
              _M_range_insert<std::byte_const*>
                        ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_1a8,uVar3,
                         ZeroS,OneL);
              local_9b8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_9b0 = "";
              local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_58.m_end = (iterator)0xec;
              file_58.m_begin = (iterator)&local_9b8;
              msg_58.m_end = pvVar11;
              msg_58.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,
                         (size_t)&local_9c8,msg_58);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_100._0_8_ = &aStack_f0;
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)local_100,local_1a8._0_8_ + local_198._8_8_,local_1a8._8_8_);
              local_128._M_dataplus._M_p._0_1_ = SUB81(&local_128.field_2,0);
              local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_128.field_2 >> 8);
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)(local_134 + 0xc),ZeroArray,0xf49d34);
              if (local_100._8_8_ == local_128._M_string_length) {
                if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
                  rVar12.super_class_property<bool>.value = (class_property<bool>)true;
                }
                else {
                  iVar6 = bcmp((void *)local_100._0_8_,
                               (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                                local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
                  rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
                }
              }
              else {
                rVar12.super_class_property<bool>.value = (class_property<bool>)false;
              }
              local_70[0] = rVar12.super_class_property<bool>.value;
              sStack_68.px = (element_type *)0x0;
              sStack_68.pn.pi_ = (sp_counted_base *)0x0;
              local_168._8_8_ = "";
              local_168._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_e0[8] = '\0';
              local_e0[0] = 200;
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(&local_180,0);
              local_e0[0x19] = (undefined1)((ulong)&local_180 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)&local_180 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)&local_180 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)&local_180 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)&local_180 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)&local_180 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)&local_180 >> 0x38);
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_48._8_8_ = local_170;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              sVar9 = 0xec;
              local_180 = (string *)local_100;
              local_170 = (undefined1  [8])(local_134 + 0xc);
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4928a,
                         (size_t)local_168,0xec,(lazy_ostream *)local_e0,
                         "std::string(ZeroArray,ZeroArray+20)",local_58);
              boost::detail::shared_count::~shared_count(&sStack_68.pn);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
                  &local_128.field_2) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                            local_128._M_dataplus._M_p._0_1_),
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._0_8_ != &aStack_f0) {
                operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1)
                               );
              }
              DataStream::read((DataStream *)local_1a8,(int)&TmpS,(void *)0x14,sVar9);
              local_9d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_9d0 = "";
              local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_59.m_end = (iterator)0xee;
              file_59.m_begin = (iterator)&local_9d8;
              msg_59.m_end = pvVar11;
              msg_59.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,
                         (size_t)&local_9e8,msg_59);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              auVar19[0] = -(ZeroS[0] == TmpS.super_base_blob<160U>.m_data._M_elems[0]);
              auVar19[1] = -(ZeroS[1] == TmpS.super_base_blob<160U>.m_data._M_elems[1]);
              auVar19[2] = -(ZeroS[2] == TmpS.super_base_blob<160U>.m_data._M_elems[2]);
              auVar19[3] = -(ZeroS[3] == TmpS.super_base_blob<160U>.m_data._M_elems[3]);
              auVar19[4] = -(ZeroS[4] == TmpS.super_base_blob<160U>.m_data._M_elems[4]);
              auVar19[5] = -(ZeroS[5] == TmpS.super_base_blob<160U>.m_data._M_elems[5]);
              auVar19[6] = -(ZeroS[6] == TmpS.super_base_blob<160U>.m_data._M_elems[6]);
              auVar19[7] = -(ZeroS[7] == TmpS.super_base_blob<160U>.m_data._M_elems[7]);
              auVar19[8] = -(ZeroS[8] == TmpS.super_base_blob<160U>.m_data._M_elems[8]);
              auVar19[9] = -(ZeroS[9] == TmpS.super_base_blob<160U>.m_data._M_elems[9]);
              auVar19[10] = -(ZeroS[10] == TmpS.super_base_blob<160U>.m_data._M_elems[10]);
              auVar19[0xb] = -(ZeroS[0xb] == TmpS.super_base_blob<160U>.m_data._M_elems[0xb]);
              auVar19[0xc] = -(ZeroS[0xc] == TmpS.super_base_blob<160U>.m_data._M_elems[0xc]);
              auVar19[0xd] = -(ZeroS[0xd] == TmpS.super_base_blob<160U>.m_data._M_elems[0xd]);
              auVar19[0xe] = -(ZeroS[0xe] == TmpS.super_base_blob<160U>.m_data._M_elems[0xe]);
              auVar19[0xf] = -(ZeroS[0xf] == TmpS.super_base_blob<160U>.m_data._M_elems[0xf]);
              auVar35[0] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x10] == (uchar)ZeroS._16_4_
                            );
              auVar35[1] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x11] ==
                            SUB41(ZeroS._16_4_,1));
              auVar35[2] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x12] ==
                            SUB41(ZeroS._16_4_,2));
              auVar35[3] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x13] ==
                            SUB41(ZeroS._16_4_,3));
              auVar35[4] = 0xff;
              auVar35[5] = 0xff;
              auVar35[6] = 0xff;
              auVar35[7] = 0xff;
              auVar35[8] = 0xff;
              auVar35[9] = 0xff;
              auVar35[10] = 0xff;
              auVar35[0xb] = 0xff;
              auVar35[0xc] = 0xff;
              auVar35[0xd] = 0xff;
              auVar35[0xe] = 0xff;
              auVar35[0xf] = 0xff;
              auVar19 = auVar19 & auVar35;
              local_100[0] = (class_property<bool>)
                             (class_property<bool>)
                             ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])ZeroS;
              local_e0[8] = '\0';
              local_e0[0] = 0x80;
              local_e0[1] = 0xe3;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81((assertion_result *)local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_0138e380;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              local_48._8_8_ = local_168;
              local_168._0_8_ = &TmpS;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf48cbc
                         ,(size_t)(local_134 + 0xc),0xee,(lazy_ostream *)local_e0,"TmpS",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              uVar3 = local_1a8._0_8_;
              if (local_1a8._8_8_ != local_1a8._0_8_) {
                local_1a8._8_8_ = local_1a8._0_8_;
              }
              local_198._8_8_ = 0;
              std::vector<std::byte,zero_after_free_allocator<std::byte>>::
              _M_range_insert<std::byte_const*>
                        ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_1a8,uVar3,
                         MaxS,&basics_registrar633);
              local_9f8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_9f0 = "";
              local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
              local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
              file_60.m_end = (iterator)0xf1;
              file_60.m_begin = (iterator)&local_9f8;
              msg_60.m_end = pvVar11;
              msg_60.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,
                         (size_t)&local_a08,msg_60);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_100._0_8_ = &aStack_f0;
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)local_100,local_1a8._0_8_ + local_198._8_8_,local_1a8._8_8_);
              local_128._M_dataplus._M_p._0_1_ = SUB81(&local_128.field_2,0);
              local_128._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_128.field_2 >> 8);
              std::__cxx11::string::_M_construct<unsigned_char_const*>
                        ((string *)(local_134 + 0xc),MaxArray,0xf49d94);
              if (local_100._8_8_ == local_128._M_string_length) {
                if ((element_type *)local_100._8_8_ == (element_type *)0x0) {
                  rVar12.super_class_property<bool>.value = (class_property<bool>)true;
                }
                else {
                  iVar6 = bcmp((void *)local_100._0_8_,
                               (void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                                local_128._M_dataplus._M_p._0_1_),local_100._8_8_);
                  rVar12.super_class_property<bool>.value = (class_property<bool>)(iVar6 == 0);
                }
              }
              else {
                rVar12.super_class_property<bool>.value = (class_property<bool>)false;
              }
              local_70[0] = rVar12.super_class_property<bool>.value;
              sStack_68.px = (element_type *)0x0;
              sStack_68.pn.pi_ = (sp_counted_base *)0x0;
              local_168._8_8_ = "";
              local_168._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_e0[8] = '\0';
              local_e0[0] = 200;
              local_e0[1] = 0x8f;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81(&local_180,0);
              local_e0[0x19] = (undefined1)((ulong)&local_180 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)&local_180 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)&local_180 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)&local_180 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)&local_180 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)&local_180 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)&local_180 >> 0x38);
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_48._8_8_ = local_170;
              pvVar10 = (iterator)0x1;
              pvVar11 = (iterator)0x2;
              sVar9 = 0xf1;
              local_180 = (string *)local_100;
              local_170 = (undefined1  [8])(local_134 + 0xc);
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_70,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf4928a,
                         (size_t)local_168,0xf1,(lazy_ostream *)local_e0,
                         "std::string(MaxArray,MaxArray+20)",local_58);
              boost::detail::shared_count::~shared_count(&sStack_68.pn);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
                  &local_128.field_2) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                            local_128._M_dataplus._M_p._0_1_),
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._0_8_ != &aStack_f0) {
                operator_delete((void *)local_100._0_8_,(ulong)(aStack_f0._M_allocated_capacity + 1)
                               );
              }
              DataStream::read((DataStream *)local_1a8,(int)&TmpS,(void *)0x14,sVar9);
              local_a18 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_a10 = "";
              local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
              local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
              file_61.m_end = (iterator)0xf3;
              file_61.m_begin = (iterator)&local_a18;
              msg_61.m_end = pvVar11;
              msg_61.m_begin = pvVar10;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,
                         (size_t)&local_a28,msg_61);
              local_b8._8_8_ = local_b8._9_8_ << 8;
              local_b8._0_8_ = &PTR__lazy_ostream_01388f08;
              apuStack_a8[0] = boost::unit_test::lazy_ostream::inst;
              auVar20[0] = -(MaxS[0] == TmpS.super_base_blob<160U>.m_data._M_elems[0]);
              auVar20[1] = -(MaxS[1] == TmpS.super_base_blob<160U>.m_data._M_elems[1]);
              auVar20[2] = -(MaxS[2] == TmpS.super_base_blob<160U>.m_data._M_elems[2]);
              auVar20[3] = -(MaxS[3] == TmpS.super_base_blob<160U>.m_data._M_elems[3]);
              auVar20[4] = -(MaxS[4] == TmpS.super_base_blob<160U>.m_data._M_elems[4]);
              auVar20[5] = -(MaxS[5] == TmpS.super_base_blob<160U>.m_data._M_elems[5]);
              auVar20[6] = -(MaxS[6] == TmpS.super_base_blob<160U>.m_data._M_elems[6]);
              auVar20[7] = -(MaxS[7] == TmpS.super_base_blob<160U>.m_data._M_elems[7]);
              auVar20[8] = -(MaxS[8] == TmpS.super_base_blob<160U>.m_data._M_elems[8]);
              auVar20[9] = -(MaxS[9] == TmpS.super_base_blob<160U>.m_data._M_elems[9]);
              auVar20[10] = -(MaxS[10] == TmpS.super_base_blob<160U>.m_data._M_elems[10]);
              auVar20[0xb] = -(MaxS[0xb] == TmpS.super_base_blob<160U>.m_data._M_elems[0xb]);
              auVar20[0xc] = -(MaxS[0xc] == TmpS.super_base_blob<160U>.m_data._M_elems[0xc]);
              auVar20[0xd] = -(MaxS[0xd] == TmpS.super_base_blob<160U>.m_data._M_elems[0xd]);
              auVar20[0xe] = -(MaxS[0xe] == TmpS.super_base_blob<160U>.m_data._M_elems[0xe]);
              auVar20[0xf] = -(MaxS[0xf] == TmpS.super_base_blob<160U>.m_data._M_elems[0xf]);
              auVar36[0] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x10] == (uchar)MaxS._16_4_)
              ;
              auVar36[1] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x11] ==
                            SUB41(MaxS._16_4_,1));
              auVar36[2] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x12] ==
                            SUB41(MaxS._16_4_,2));
              auVar36[3] = -(TmpS.super_base_blob<160U>.m_data._M_elems[0x13] ==
                            SUB41(MaxS._16_4_,3));
              auVar36[4] = 0xff;
              auVar36[5] = 0xff;
              auVar36[6] = 0xff;
              auVar36[7] = 0xff;
              auVar36[8] = 0xff;
              auVar36[9] = 0xff;
              auVar36[10] = 0xff;
              auVar36[0xb] = 0xff;
              auVar36[0xc] = 0xff;
              auVar36[0xd] = 0xff;
              auVar36[0xe] = 0xff;
              auVar36[0xf] = 0xff;
              auVar20 = auVar20 & auVar36;
              local_100[0] = (class_property<bool>)
                             (class_property<bool>)
                             ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
              apuStack_a8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_100._8_8_ = (element_type *)0x0;
              aStack_f0._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_128._M_dataplus._M_p._0_1_ = 0x67;
              local_128._M_dataplus._M_p._1_7_ = 0xf48b;
              local_128._M_string_length = 0xf48bcd;
              local_70 = (undefined1  [8])MaxS;
              local_e0[8] = '\0';
              local_e0[0] = 0x80;
              local_e0[1] = 0xe3;
              local_e0[2] = '8';
              local_e0[3] = '\x01';
              local_e0[4] = '\0';
              local_e0[5] = '\0';
              local_e0[6] = '\0';
              local_e0[7] = '\0';
              local_e0[0x10] = '8';
              local_e0[0x11] = 0xd1;
              local_e0[0x12] = '9';
              local_e0[0x13] = '\x01';
              local_e0[0x14] = '\0';
              local_e0[0x15] = '\0';
              local_e0[0x16] = '\0';
              local_e0[0x17] = '\0';
              local_e0[0x18] = SUB81((assertion_result *)local_70,0);
              local_e0[0x19] = (undefined1)((ulong)local_70 >> 8);
              local_e0[0x1a] = (undefined1)((ulong)local_70 >> 0x10);
              local_e0[0x1b] = (undefined1)((ulong)local_70 >> 0x18);
              local_e0[0x1c] = (undefined1)((ulong)local_70 >> 0x20);
              local_e0[0x1d] = (undefined1)((ulong)local_70 >> 0x28);
              local_e0[0x1e] = (undefined1)((ulong)local_70 >> 0x30);
              local_e0[0x1f] = (undefined1)((ulong)local_70 >> 0x38);
              local_168._0_8_ = &TmpS;
              local_58[8] = '\0';
              local_58._0_8_ = &PTR__lazy_ostream_0138e380;
              local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              local_48._8_8_ = (uint160 *)local_168;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_100,(lazy_ostream *)local_b8,1,2,REQUIRE,0xf48cc7
                         ,(size_t)(local_134 + 0xc),0xf3,(lazy_ostream *)local_e0,"TmpS",local_58);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_f0._M_allocated_capacity);
              if (local_1a8._8_8_ != local_1a8._0_8_) {
                local_1a8._8_8_ = local_1a8._0_8_;
              }
              local_198._8_8_ = 0;
              std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                        ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_1a8
                        );
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                return;
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(methods) // GetHex SetHexDeprecated FromHex begin() end() size() GetLow64 GetSerializeSize, Serialize, Unserialize
{
    BOOST_CHECK_EQUAL(R1L.GetHex(), R1L.ToString());
    BOOST_CHECK_EQUAL(R2L.GetHex(), R2L.ToString());
    BOOST_CHECK_EQUAL(OneL.GetHex(), OneL.ToString());
    BOOST_CHECK_EQUAL(MaxL.GetHex(), MaxL.ToString());
    uint256 TmpL(R1L);
    BOOST_CHECK_EQUAL(TmpL, R1L);
    // Verify previous values don't persist when setting to truncated string.
    TmpL.SetHexDeprecated("21");
    BOOST_CHECK_EQUAL(TmpL.ToString(), "0000000000000000000000000000000000000000000000000000000000000021");
    BOOST_CHECK_EQUAL(uint256::FromHex(R2L.ToString()).value(), R2L);
    BOOST_CHECK_EQUAL(uint256::FromHex(ZeroL.ToString()).value(), uint256());

    TmpL = uint256::FromHex(R1L.ToString()).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(R1L.begin(), R1L.end(), R1Array, R1Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(TmpL.begin(), TmpL.end(), R1Array, R1Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(R2L.begin(), R2L.end(), R2Array, R2Array + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(ZeroL.begin(), ZeroL.end(), ZeroArray, ZeroArray + uint256::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(OneL.begin(), OneL.end(), OneArray, OneArray + uint256::size());
    BOOST_CHECK_EQUAL(R1L.size(), sizeof(R1L));
    BOOST_CHECK_EQUAL(sizeof(R1L), 32);
    BOOST_CHECK_EQUAL(R1L.size(), 32);
    BOOST_CHECK_EQUAL(R2L.size(), 32);
    BOOST_CHECK_EQUAL(ZeroL.size(), 32);
    BOOST_CHECK_EQUAL(MaxL.size(), 32);
    BOOST_CHECK_EQUAL(R1L.begin() + 32, R1L.end());
    BOOST_CHECK_EQUAL(R2L.begin() + 32, R2L.end());
    BOOST_CHECK_EQUAL(OneL.begin() + 32, OneL.end());
    BOOST_CHECK_EQUAL(MaxL.begin() + 32, MaxL.end());
    BOOST_CHECK_EQUAL(TmpL.begin() + 32, TmpL.end());
    BOOST_CHECK_EQUAL(GetSerializeSize(R1L), 32);
    BOOST_CHECK_EQUAL(GetSerializeSize(ZeroL), 32);

    DataStream ss{};
    ss << R1L;
    BOOST_CHECK_EQUAL(ss.str(), std::string(R1Array,R1Array+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(R1L, TmpL);
    ss.clear();
    ss << ZeroL;
    BOOST_CHECK_EQUAL(ss.str(), std::string(ZeroArray,ZeroArray+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(ZeroL, TmpL);
    ss.clear();
    ss << MaxL;
    BOOST_CHECK_EQUAL(ss.str(), std::string(MaxArray,MaxArray+32));
    ss >> TmpL;
    BOOST_CHECK_EQUAL(MaxL, TmpL);
    ss.clear();

    BOOST_CHECK_EQUAL(R1S.GetHex(), R1S.ToString());
    BOOST_CHECK_EQUAL(R2S.GetHex(), R2S.ToString());
    BOOST_CHECK_EQUAL(OneS.GetHex(), OneS.ToString());
    BOOST_CHECK_EQUAL(MaxS.GetHex(), MaxS.ToString());
    uint160 TmpS(R1S);
    BOOST_CHECK_EQUAL(TmpS, R1S);
    BOOST_CHECK_EQUAL(uint160::FromHex(R2S.ToString()).value(), R2S);
    BOOST_CHECK_EQUAL(uint160::FromHex(ZeroS.ToString()).value(), uint160());

    TmpS = uint160::FromHex(R1S.ToString()).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(R1S.begin(), R1S.end(), R1Array, R1Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(TmpS.begin(), TmpS.end(), R1Array, R1Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(R2S.begin(), R2S.end(), R2Array, R2Array + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(ZeroS.begin(), ZeroS.end(), ZeroArray, ZeroArray + uint160::size());
    BOOST_CHECK_EQUAL_COLLECTIONS(OneS.begin(), OneS.end(), OneArray, OneArray + uint160::size());
    BOOST_CHECK_EQUAL(R1S.size(), sizeof(R1S));
    BOOST_CHECK_EQUAL(sizeof(R1S), 20);
    BOOST_CHECK_EQUAL(R1S.size(), 20);
    BOOST_CHECK_EQUAL(R2S.size(), 20);
    BOOST_CHECK_EQUAL(ZeroS.size(), 20);
    BOOST_CHECK_EQUAL(MaxS.size(), 20);
    BOOST_CHECK_EQUAL(R1S.begin() + 20, R1S.end());
    BOOST_CHECK_EQUAL(R2S.begin() + 20, R2S.end());
    BOOST_CHECK_EQUAL(OneS.begin() + 20, OneS.end());
    BOOST_CHECK_EQUAL(MaxS.begin() + 20, MaxS.end());
    BOOST_CHECK_EQUAL(TmpS.begin() + 20, TmpS.end());
    BOOST_CHECK_EQUAL(GetSerializeSize(R1S), 20);
    BOOST_CHECK_EQUAL(GetSerializeSize(ZeroS), 20);

    ss << R1S;
    BOOST_CHECK_EQUAL(ss.str(), std::string(R1Array,R1Array+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(R1S, TmpS);
    ss.clear();
    ss << ZeroS;
    BOOST_CHECK_EQUAL(ss.str(), std::string(ZeroArray,ZeroArray+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(ZeroS, TmpS);
    ss.clear();
    ss << MaxS;
    BOOST_CHECK_EQUAL(ss.str(), std::string(MaxArray,MaxArray+20));
    ss >> TmpS;
    BOOST_CHECK_EQUAL(MaxS, TmpS);
    ss.clear();
}